

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiMBIntersectorK<4,16>::
     occluded_t<embree::avx512::RibbonCurve1IntersectorK<embree::BSplineCurveT,16,8>,embree::avx512::Occluded1KEpilogMU<8,16,true>>
               (Precalculations *pre,RayK<16> *ray,size_t k,RayQueryContext *context,Primitive *prim
               )

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  uint uVar6;
  int iVar7;
  Geometry *pGVar8;
  __int_type_conflict _Var9;
  long lVar10;
  RTCFilterFunctionN p_Var11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined8 uVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  byte bVar63;
  ulong uVar64;
  long lVar65;
  Geometry *geometry;
  long lVar66;
  long lVar67;
  ulong uVar68;
  bool bVar69;
  ulong uVar70;
  undefined1 auVar71 [8];
  undefined8 unaff_R13;
  ulong uVar72;
  byte bVar73;
  float fVar74;
  float fVar134;
  float fVar136;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  float fVar75;
  float fVar135;
  float fVar137;
  float fVar138;
  float fVar139;
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  float fVar140;
  float fVar141;
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [64];
  undefined1 auVar133 [64];
  undefined4 uVar142;
  vint4 bi_2;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [64];
  float fVar149;
  undefined8 uVar150;
  vint4 bi_1;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [32];
  vint4 bi;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  float fVar159;
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  vint4 ai;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  vint4 ai_1;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  float fVar173;
  float fVar174;
  float fVar175;
  vint4 ai_2;
  undefined1 auVar176 [32];
  float fVar177;
  uint uVar178;
  float fVar180;
  undefined1 auVar179 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [32];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [64];
  undefined1 auVar195 [64];
  undefined1 auVar196 [64];
  undefined1 auVar197 [64];
  undefined1 auVar198 [64];
  undefined1 auVar199 [64];
  undefined1 auVar200 [64];
  undefined1 auVar201 [64];
  undefined1 auVar202 [64];
  undefined1 auVar203 [64];
  RTCFilterFunctionNArguments args;
  vint<16> mask;
  RTCFilterFunctionNArguments local_890;
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_810 [16];
  undefined1 local_800 [16];
  undefined1 local_7f0 [16];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  LinearSpace3fa *local_750;
  Primitive *local_748;
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_690 [8];
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  uint local_660;
  uint uStack_65c;
  uint uStack_658;
  uint uStack_654;
  uint uStack_650;
  uint uStack_64c;
  uint uStack_648;
  uint uStack_644;
  undefined1 local_640 [64];
  undefined1 local_5f0 [16];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined4 local_580;
  int local_57c;
  undefined8 local_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 local_550;
  undefined8 uStack_548;
  float local_520 [4];
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined4 uStack_3a4;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  uVar64 = (ulong)(byte)prim[1];
  lVar65 = uVar64 * 0x25;
  auVar27 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 4 + 6)));
  auVar85 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 5 + 6)));
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 6 + 6)));
  auVar82 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 0xf + 6)));
  auVar83 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)prim[1] * 0x10 + 6)));
  auVar84 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 0x11 + 6)));
  auVar86 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 0x1a + 6)));
  auVar87 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 0x1b + 6)));
  auVar88 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 0x1c + 6)));
  uVar142 = *(undefined4 *)(prim + lVar65 + 0x12);
  auVar191._4_4_ = uVar142;
  auVar191._0_4_ = uVar142;
  auVar191._8_4_ = uVar142;
  auVar191._12_4_ = uVar142;
  auVar89 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar89 = vinsertps_avx(auVar89,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar76 = vsubps_avx512vl(auVar89,*(undefined1 (*) [16])(prim + lVar65 + 6));
  fVar159 = (*(float *)(ray + k * 4 + 0x1c0) - *(float *)(prim + lVar65 + 0x16)) *
            *(float *)(prim + lVar65 + 0x1a);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + uVar64 * 7 + 6);
  auVar95 = vpmovsxwd_avx(auVar89);
  auVar94._8_8_ = 0;
  auVar94._0_8_ = *(ulong *)(prim + uVar64 * 0xb + 6);
  auVar28 = vpmovsxwd_avx(auVar94);
  auVar91._8_8_ = 0;
  auVar91._0_8_ = *(ulong *)(prim + uVar64 * 9 + 6);
  auVar29 = vpmovsxwd_avx(auVar91);
  auVar90._8_8_ = 0;
  auVar90._0_8_ = *(ulong *)(prim + uVar64 * 0xd + 6);
  auVar143 = vpmovsxwd_avx(auVar90);
  auVar77 = vpbroadcastd_avx512vl();
  auVar89 = vinsertps_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                              ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar89 = vinsertps_avx512f(auVar89,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar76 = vmulps_avx512vl(auVar191,auVar76);
  auVar78 = vmulps_avx512vl(auVar191,auVar89);
  auVar79 = vcvtdq2ps_avx512vl(auVar27);
  auVar80 = vcvtdq2ps_avx512vl(auVar85);
  auVar81 = vcvtdq2ps_avx512vl(auVar81);
  auVar82 = vcvtdq2ps_avx512vl(auVar82);
  auVar83 = vcvtdq2ps_avx512vl(auVar83);
  auVar89 = vcvtdq2ps_avx(auVar84);
  auVar94 = vcvtdq2ps_avx(auVar86);
  auVar91 = vcvtdq2ps_avx(auVar87);
  auVar90 = vcvtdq2ps_avx(auVar88);
  uVar142 = auVar78._0_4_;
  auVar183._4_4_ = uVar142;
  auVar183._0_4_ = uVar142;
  auVar183._8_4_ = uVar142;
  auVar183._12_4_ = uVar142;
  auVar27 = vshufps_avx(auVar78,auVar78,0x55);
  auVar85 = vshufps_avx(auVar78,auVar78,0xaa);
  auVar84 = vmulps_avx512vl(auVar85,auVar81);
  auVar151._0_4_ = auVar85._0_4_ * auVar89._0_4_;
  auVar151._4_4_ = auVar85._4_4_ * auVar89._4_4_;
  auVar151._8_4_ = auVar85._8_4_ * auVar89._8_4_;
  auVar151._12_4_ = auVar85._12_4_ * auVar89._12_4_;
  auVar78._0_4_ = auVar90._0_4_ * auVar85._0_4_;
  auVar78._4_4_ = auVar90._4_4_ * auVar85._4_4_;
  auVar78._8_4_ = auVar90._8_4_ * auVar85._8_4_;
  auVar78._12_4_ = auVar90._12_4_ * auVar85._12_4_;
  auVar85 = vfmadd231ps_avx512vl(auVar84,auVar27,auVar80);
  auVar84 = vfmadd231ps_avx512vl(auVar151,auVar27,auVar83);
  auVar27 = vfmadd231ps_fma(auVar78,auVar91,auVar27);
  auVar85 = vfmadd231ps_avx512vl(auVar85,auVar183,auVar79);
  auVar84 = vfmadd231ps_avx512vl(auVar84,auVar183,auVar82);
  auVar27 = vfmadd231ps_fma(auVar27,auVar94,auVar183);
  auVar86 = vbroadcastss_avx512vl(auVar76);
  auVar87 = vshufps_avx512vl(auVar76,auVar76,0x55);
  auVar88 = vshufps_avx512vl(auVar76,auVar76,0xaa);
  auVar81 = vmulps_avx512vl(auVar88,auVar81);
  auVar89 = vmulps_avx512vl(auVar88,auVar89);
  auVar90 = vmulps_avx512vl(auVar88,auVar90);
  auVar81 = vfmadd231ps_avx512vl(auVar81,auVar87,auVar80);
  auVar89 = vfmadd231ps_avx512vl(auVar89,auVar87,auVar83);
  auVar91 = vfmadd231ps_avx512vl(auVar90,auVar87,auVar91);
  auVar79 = vfmadd231ps_avx512vl(auVar81,auVar86,auVar79);
  auVar80 = vfmadd231ps_avx512vl(auVar89,auVar86,auVar82);
  auVar78 = vfmadd231ps_fma(auVar91,auVar86,auVar94);
  auVar190._8_4_ = 0x7fffffff;
  auVar190._0_8_ = 0x7fffffff7fffffff;
  auVar190._12_4_ = 0x7fffffff;
  auVar89 = vandps_avx(auVar190,auVar85);
  auVar187._8_4_ = 0x219392ef;
  auVar187._0_8_ = 0x219392ef219392ef;
  auVar187._12_4_ = 0x219392ef;
  uVar72 = vcmpps_avx512vl(auVar89,auVar187,1);
  bVar69 = (bool)((byte)uVar72 & 1);
  auVar76._0_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar85._0_4_;
  bVar69 = (bool)((byte)(uVar72 >> 1) & 1);
  auVar76._4_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar85._4_4_;
  bVar69 = (bool)((byte)(uVar72 >> 2) & 1);
  auVar76._8_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar85._8_4_;
  bVar69 = (bool)((byte)(uVar72 >> 3) & 1);
  auVar76._12_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar85._12_4_;
  auVar89 = vandps_avx(auVar190,auVar84);
  uVar72 = vcmpps_avx512vl(auVar89,auVar187,1);
  bVar69 = (bool)((byte)uVar72 & 1);
  auVar92._0_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar84._0_4_;
  bVar69 = (bool)((byte)(uVar72 >> 1) & 1);
  auVar92._4_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar84._4_4_;
  bVar69 = (bool)((byte)(uVar72 >> 2) & 1);
  auVar92._8_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar84._8_4_;
  bVar69 = (bool)((byte)(uVar72 >> 3) & 1);
  auVar92._12_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar84._12_4_;
  auVar89 = vandps_avx(auVar190,auVar27);
  uVar72 = vcmpps_avx512vl(auVar89,auVar187,1);
  bVar69 = (bool)((byte)uVar72 & 1);
  auVar93._0_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar27._0_4_;
  bVar69 = (bool)((byte)(uVar72 >> 1) & 1);
  auVar93._4_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar27._4_4_;
  bVar69 = (bool)((byte)(uVar72 >> 2) & 1);
  auVar93._8_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar27._8_4_;
  bVar69 = (bool)((byte)(uVar72 >> 3) & 1);
  auVar93._12_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar27._12_4_;
  auVar94 = vrcp14ps_avx512vl(auVar76);
  auVar188._8_4_ = 0x3f800000;
  auVar188._0_8_ = 0x3f8000003f800000;
  auVar188._12_4_ = 0x3f800000;
  auVar89 = vfnmadd213ps_fma(auVar76,auVar94,auVar188);
  auVar90 = vfmadd132ps_fma(auVar89,auVar94,auVar94);
  auVar94 = vrcp14ps_avx512vl(auVar92);
  auVar89 = vfnmadd213ps_fma(auVar92,auVar94,auVar188);
  auVar88 = vfmadd132ps_fma(auVar89,auVar94,auVar94);
  auVar94 = vrcp14ps_avx512vl(auVar93);
  auVar89 = vfnmadd213ps_fma(auVar93,auVar94,auVar188);
  auVar76 = vfmadd132ps_fma(auVar89,auVar94,auVar94);
  auVar162._4_4_ = fVar159;
  auVar162._0_4_ = fVar159;
  auVar162._8_4_ = fVar159;
  auVar162._12_4_ = fVar159;
  auVar89 = vcvtdq2ps_avx(auVar95);
  auVar94 = vcvtdq2ps_avx(auVar28);
  auVar94 = vsubps_avx(auVar94,auVar89);
  auVar95 = vfmadd213ps_fma(auVar94,auVar162,auVar89);
  auVar89 = vcvtdq2ps_avx(auVar29);
  auVar94 = vcvtdq2ps_avx(auVar143);
  auVar94 = vsubps_avx(auVar94,auVar89);
  auVar28 = vfmadd213ps_fma(auVar94,auVar162,auVar89);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + uVar64 * 0x12 + 6);
  auVar89 = vpmovsxwd_avx(auVar27);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar64 * 0x16 + 6);
  auVar94 = vpmovsxwd_avx(auVar85);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar91 = vsubps_avx(auVar94,auVar89);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar64 * 0x14 + 6);
  auVar94 = vpmovsxwd_avx(auVar81);
  auVar91 = vfmadd213ps_fma(auVar91,auVar162,auVar89);
  auVar89 = vcvtdq2ps_avx(auVar94);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar64 * 0x18 + 6);
  auVar94 = vpmovsxwd_avx(auVar82);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar94 = vsubps_avx(auVar94,auVar89);
  auVar27 = vfmadd213ps_fma(auVar94,auVar162,auVar89);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar64 * 0x1d + 6);
  auVar89 = vpmovsxwd_avx(auVar83);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar64 * 0x21 + 6);
  auVar94 = vpmovsxwd_avx(auVar84);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar94 = vsubps_avx(auVar94,auVar89);
  auVar85 = vfmadd213ps_fma(auVar94,auVar162,auVar89);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar64 * 0x1f + 6);
  auVar89 = vpmovsxwd_avx(auVar86);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar64 * 0x23 + 6);
  auVar94 = vpmovsxwd_avx(auVar87);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar94 = vsubps_avx(auVar94,auVar89);
  auVar94 = vfmadd213ps_fma(auVar94,auVar162,auVar89);
  auVar89 = vsubps_avx(auVar95,auVar79);
  auVar163._0_4_ = auVar90._0_4_ * auVar89._0_4_;
  auVar163._4_4_ = auVar90._4_4_ * auVar89._4_4_;
  auVar163._8_4_ = auVar90._8_4_ * auVar89._8_4_;
  auVar163._12_4_ = auVar90._12_4_ * auVar89._12_4_;
  auVar89 = vsubps_avx(auVar28,auVar79);
  auVar155._0_4_ = auVar90._0_4_ * auVar89._0_4_;
  auVar155._4_4_ = auVar90._4_4_ * auVar89._4_4_;
  auVar155._8_4_ = auVar90._8_4_ * auVar89._8_4_;
  auVar155._12_4_ = auVar90._12_4_ * auVar89._12_4_;
  auVar89 = vsubps_avx(auVar91,auVar80);
  auVar170._0_4_ = auVar88._0_4_ * auVar89._0_4_;
  auVar170._4_4_ = auVar88._4_4_ * auVar89._4_4_;
  auVar170._8_4_ = auVar88._8_4_ * auVar89._8_4_;
  auVar170._12_4_ = auVar88._12_4_ * auVar89._12_4_;
  auVar89 = vsubps_avx(auVar27,auVar80);
  auVar79._0_4_ = auVar88._0_4_ * auVar89._0_4_;
  auVar79._4_4_ = auVar88._4_4_ * auVar89._4_4_;
  auVar79._8_4_ = auVar88._8_4_ * auVar89._8_4_;
  auVar79._12_4_ = auVar88._12_4_ * auVar89._12_4_;
  auVar89 = vsubps_avx(auVar85,auVar78);
  auVar80._0_4_ = auVar76._0_4_ * auVar89._0_4_;
  auVar80._4_4_ = auVar76._4_4_ * auVar89._4_4_;
  auVar80._8_4_ = auVar76._8_4_ * auVar89._8_4_;
  auVar80._12_4_ = auVar76._12_4_ * auVar89._12_4_;
  auVar89 = vsubps_avx(auVar94,auVar78);
  auVar143._0_4_ = auVar76._0_4_ * auVar89._0_4_;
  auVar143._4_4_ = auVar76._4_4_ * auVar89._4_4_;
  auVar143._8_4_ = auVar76._8_4_ * auVar89._8_4_;
  auVar143._12_4_ = auVar76._12_4_ * auVar89._12_4_;
  auVar89 = vpminsd_avx(auVar163,auVar155);
  auVar94 = vpminsd_avx(auVar170,auVar79);
  auVar89 = vmaxps_avx(auVar89,auVar94);
  auVar94 = vpminsd_avx(auVar80,auVar143);
  uVar142 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar88._4_4_ = uVar142;
  auVar88._0_4_ = uVar142;
  auVar88._8_4_ = uVar142;
  auVar88._12_4_ = uVar142;
  auVar94 = vmaxps_avx512vl(auVar94,auVar88);
  auVar89 = vmaxps_avx(auVar89,auVar94);
  auVar95._8_4_ = 0x3f7ffffa;
  auVar95._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar95._12_4_ = 0x3f7ffffa;
  local_5f0 = vmulps_avx512vl(auVar89,auVar95);
  auVar89 = vpmaxsd_avx(auVar163,auVar155);
  auVar94 = vpmaxsd_avx(auVar170,auVar79);
  auVar89 = vminps_avx(auVar89,auVar94);
  auVar94 = vpmaxsd_avx(auVar80,auVar143);
  uVar142 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar28._4_4_ = uVar142;
  auVar28._0_4_ = uVar142;
  auVar28._8_4_ = uVar142;
  auVar28._12_4_ = uVar142;
  auVar94 = vminps_avx512vl(auVar94,auVar28);
  auVar89 = vminps_avx(auVar89,auVar94);
  auVar29._8_4_ = 0x3f800003;
  auVar29._0_8_ = 0x3f8000033f800003;
  auVar29._12_4_ = 0x3f800003;
  auVar89 = vmulps_avx512vl(auVar89,auVar29);
  uVar150 = vcmpps_avx512vl(local_5f0,auVar89,2);
  uVar30 = vpcmpgtd_avx512vl(auVar77,_DAT_01f4ad30);
  uVar72 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),(uint)((byte)uVar150 & 0xf & (byte)uVar30));
  local_750 = pre->ray_space + k;
  auVar148 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_340 = vmovdqa64_avx512f(auVar148);
  local_748 = prim;
  for (; uVar72 != 0; uVar72 = (ulong)((uint)uVar72 & (uint)uVar72 + 0xf & (uint)uVar150)) {
    lVar65 = 0;
    for (uVar64 = uVar72; (uVar64 & 1) == 0; uVar64 = uVar64 >> 1 | 0x8000000000000000) {
      lVar65 = lVar65 + 1;
    }
    uVar6 = *(uint *)(local_748 + 2);
    pGVar8 = (context->scene->geometries).items[uVar6].ptr;
    uVar64 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                             (ulong)*(uint *)(local_748 + lVar65 * 4 + 6) *
                             pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                             _M_i);
    fVar159 = (pGVar8->time_range).lower;
    fVar159 = pGVar8->fnumTimeSegments *
              ((*(float *)(ray + k * 4 + 0x1c0) - fVar159) / ((pGVar8->time_range).upper - fVar159))
    ;
    auVar89 = vroundss_avx(ZEXT416((uint)fVar159),ZEXT416((uint)fVar159),9);
    auVar89 = vminss_avx(auVar89,ZEXT416((uint)(pGVar8->fnumTimeSegments + -1.0)));
    auVar89 = vmaxss_avx(ZEXT816(0) << 0x20,auVar89);
    fVar159 = fVar159 - auVar89._0_4_;
    _Var9 = pGVar8[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar67 = (long)(int)auVar89._0_4_ * 0x38;
    lVar65 = *(long *)(_Var9 + 0x10 + lVar67);
    lVar66 = *(long *)(_Var9 + 0x38 + lVar67);
    lVar10 = *(long *)(_Var9 + 0x48 + lVar67);
    auVar152._4_4_ = fVar159;
    auVar152._0_4_ = fVar159;
    auVar152._8_4_ = fVar159;
    auVar152._12_4_ = fVar159;
    pfVar3 = (float *)(lVar66 + uVar64 * lVar10);
    auVar185._0_4_ = fVar159 * *pfVar3;
    auVar185._4_4_ = fVar159 * pfVar3[1];
    auVar185._8_4_ = fVar159 * pfVar3[2];
    auVar185._12_4_ = fVar159 * pfVar3[3];
    pfVar3 = (float *)(lVar66 + (uVar64 + 1) * lVar10);
    auVar186._0_4_ = fVar159 * *pfVar3;
    auVar186._4_4_ = fVar159 * pfVar3[1];
    auVar186._8_4_ = fVar159 * pfVar3[2];
    auVar186._12_4_ = fVar159 * pfVar3[3];
    auVar89 = vmulps_avx512vl(auVar152,*(undefined1 (*) [16])(lVar66 + (uVar64 + 2) * lVar10));
    auVar94 = vmulps_avx512vl(auVar152,*(undefined1 (*) [16])(lVar66 + lVar10 * (uVar64 + 3)));
    lVar66 = *(long *)(_Var9 + lVar67);
    fVar159 = 1.0 - fVar159;
    auVar77._4_4_ = fVar159;
    auVar77._0_4_ = fVar159;
    auVar77._8_4_ = fVar159;
    auVar77._12_4_ = fVar159;
    local_7f0 = vfmadd231ps_fma(auVar185,auVar77,*(undefined1 (*) [16])(lVar66 + lVar65 * uVar64));
    local_800 = vfmadd231ps_fma(auVar186,auVar77,
                                *(undefined1 (*) [16])(lVar66 + lVar65 * (uVar64 + 1)));
    local_810 = vfmadd231ps_avx512vl
                          (auVar89,auVar77,*(undefined1 (*) [16])(lVar66 + lVar65 * (uVar64 + 2)));
    _local_690 = vfmadd231ps_avx512vl
                           (auVar94,auVar77,*(undefined1 (*) [16])(lVar66 + lVar65 * (uVar64 + 3)));
    iVar7 = (int)pGVar8[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar89 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                            0x1c);
    auVar89 = vinsertps_avx(auVar89,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
    auVar91 = vsubps_avx(local_7f0,auVar89);
    uVar142 = auVar91._0_4_;
    auVar156._4_4_ = uVar142;
    auVar156._0_4_ = uVar142;
    auVar156._8_4_ = uVar142;
    auVar156._12_4_ = uVar142;
    auVar94 = vshufps_avx(auVar91,auVar91,0x55);
    auVar91 = vshufps_avx(auVar91,auVar91,0xaa);
    aVar4 = (local_750->vx).field_0;
    aVar5 = (local_750->vy).field_0;
    fVar159 = (local_750->vz).field_0.m128[0];
    fVar177 = *(float *)((long)&(local_750->vz).field_0 + 4);
    fVar180 = *(float *)((long)&(local_750->vz).field_0 + 8);
    fVar149 = *(float *)((long)&(local_750->vz).field_0 + 0xc);
    auVar179._0_4_ = fVar159 * auVar91._0_4_;
    auVar179._4_4_ = fVar177 * auVar91._4_4_;
    auVar179._8_4_ = fVar180 * auVar91._8_4_;
    auVar179._12_4_ = fVar149 * auVar91._12_4_;
    auVar94 = vfmadd231ps_fma(auVar179,(undefined1  [16])aVar5,auVar94);
    auVar90 = vfmadd231ps_fma(auVar94,(undefined1  [16])aVar4,auVar156);
    auVar91 = vsubps_avx(local_800,auVar89);
    uVar142 = auVar91._0_4_;
    auVar157._4_4_ = uVar142;
    auVar157._0_4_ = uVar142;
    auVar157._8_4_ = uVar142;
    auVar157._12_4_ = uVar142;
    auVar94 = vshufps_avx(auVar91,auVar91,0x55);
    auVar91 = vshufps_avx(auVar91,auVar91,0xaa);
    auVar181._0_4_ = fVar159 * auVar91._0_4_;
    auVar181._4_4_ = fVar177 * auVar91._4_4_;
    auVar181._8_4_ = fVar180 * auVar91._8_4_;
    auVar181._12_4_ = fVar149 * auVar91._12_4_;
    auVar94 = vfmadd231ps_fma(auVar181,(undefined1  [16])aVar5,auVar94);
    auVar27 = vfmadd231ps_fma(auVar94,(undefined1  [16])aVar4,auVar157);
    auVar91 = vsubps_avx512vl(local_810,auVar89);
    uVar142 = auVar91._0_4_;
    auVar158._4_4_ = uVar142;
    auVar158._0_4_ = uVar142;
    auVar158._8_4_ = uVar142;
    auVar158._12_4_ = uVar142;
    auVar94 = vshufps_avx(auVar91,auVar91,0x55);
    auVar91 = vshufps_avx(auVar91,auVar91,0xaa);
    auVar184._0_4_ = fVar159 * auVar91._0_4_;
    auVar184._4_4_ = fVar177 * auVar91._4_4_;
    auVar184._8_4_ = fVar180 * auVar91._8_4_;
    auVar184._12_4_ = fVar149 * auVar91._12_4_;
    auVar94 = vfmadd231ps_fma(auVar184,(undefined1  [16])aVar5,auVar94);
    auVar85 = vfmadd231ps_fma(auVar94,(undefined1  [16])aVar4,auVar158);
    auVar94 = vsubps_avx512vl(_local_690,auVar89);
    uVar142 = auVar94._0_4_;
    auVar153._4_4_ = uVar142;
    auVar153._0_4_ = uVar142;
    auVar153._8_4_ = uVar142;
    auVar153._12_4_ = uVar142;
    auVar89 = vshufps_avx(auVar94,auVar94,0x55);
    auVar94 = vshufps_avx(auVar94,auVar94,0xaa);
    auVar189._0_4_ = fVar159 * auVar94._0_4_;
    auVar189._4_4_ = fVar177 * auVar94._4_4_;
    auVar189._8_4_ = fVar180 * auVar94._8_4_;
    auVar189._12_4_ = fVar149 * auVar94._12_4_;
    auVar89 = vfmadd231ps_fma(auVar189,(undefined1  [16])aVar5,auVar89);
    auVar81 = vfmadd231ps_fma(auVar89,(undefined1  [16])aVar4,auVar153);
    lVar65 = (long)iVar7 * 0x44;
    auVar110 = *(undefined1 (*) [32])(bspline_basis0 + lVar65);
    uVar142 = auVar90._0_4_;
    local_700._4_4_ = uVar142;
    local_700._0_4_ = uVar142;
    local_700._8_4_ = uVar142;
    local_700._12_4_ = uVar142;
    local_700._16_4_ = uVar142;
    local_700._20_4_ = uVar142;
    local_700._24_4_ = uVar142;
    local_700._28_4_ = uVar142;
    auVar96._8_4_ = 1;
    auVar96._0_8_ = 0x100000001;
    auVar96._12_4_ = 1;
    auVar96._16_4_ = 1;
    auVar96._20_4_ = 1;
    auVar96._24_4_ = 1;
    auVar96._28_4_ = 1;
    local_6e0 = vpermps_avx2(auVar96,ZEXT1632(auVar90));
    auVar111 = *(undefined1 (*) [32])(bspline_basis0 + lVar65 + 0x484);
    uVar142 = auVar27._0_4_;
    local_840._4_4_ = uVar142;
    local_840._0_4_ = uVar142;
    local_840._8_4_ = uVar142;
    local_840._12_4_ = uVar142;
    local_840._16_4_ = uVar142;
    local_840._20_4_ = uVar142;
    local_840._24_4_ = uVar142;
    local_840._28_4_ = uVar142;
    local_860 = vpermps_avx512vl(auVar96,ZEXT1632(auVar27));
    auVar109 = *(undefined1 (*) [32])(bspline_basis0 + lVar65 + 0x908);
    local_7a0 = vbroadcastss_avx512vl(auVar85);
    local_720 = vpermps_avx512vl(auVar96,ZEXT1632(auVar85));
    auVar108 = *(undefined1 (*) [32])(bspline_basis0 + lVar65 + 0xd8c);
    local_7c0 = vbroadcastss_avx512vl(auVar81);
    auVar200 = ZEXT3264(local_7c0);
    local_7e0 = vpermps_avx512vl(auVar96,ZEXT1632(auVar81));
    auVar202 = ZEXT3264(local_7e0);
    auVar96 = vmulps_avx512vl(local_7c0,auVar108);
    auVar97 = vmulps_avx512vl(local_7e0,auVar108);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar109,local_7a0);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar109,local_720);
    auVar89 = vfmadd231ps_fma(auVar96,auVar111,local_840);
    auVar96 = vfmadd231ps_avx512vl(auVar97,auVar111,local_860);
    auVar98 = vfmadd231ps_avx512vl(ZEXT1632(auVar89),auVar110,local_700);
    auVar99 = vfmadd231ps_avx512vl(auVar96,auVar110,local_6e0);
    auVar96 = *(undefined1 (*) [32])(bspline_basis1 + lVar65);
    auVar97 = *(undefined1 (*) [32])(bspline_basis1 + lVar65 + 0x484);
    auVar107 = *(undefined1 (*) [32])(bspline_basis1 + lVar65 + 0x908);
    auVar106 = *(undefined1 (*) [32])(bspline_basis1 + lVar65 + 0xd8c);
    auVar100 = vmulps_avx512vl(local_7c0,auVar106);
    auVar101 = vmulps_avx512vl(local_7e0,auVar106);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar107,local_7a0);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar107,local_720);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar97,local_840);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar97,local_860);
    auVar82 = vfmadd231ps_fma(auVar100,auVar96,local_700);
    auVar83 = vfmadd231ps_fma(auVar101,auVar96,local_6e0);
    auVar100 = vsubps_avx512vl(ZEXT1632(auVar82),auVar98);
    auVar101 = vsubps_avx512vl(ZEXT1632(auVar83),auVar99);
    auVar102 = vmulps_avx512vl(auVar99,auVar100);
    auVar103 = vmulps_avx512vl(auVar98,auVar101);
    auVar102 = vsubps_avx512vl(auVar102,auVar103);
    auVar89 = vshufps_avx(local_7f0,local_7f0,0xff);
    uVar150 = auVar89._0_8_;
    local_360._8_8_ = uVar150;
    local_360._0_8_ = uVar150;
    local_360._16_8_ = uVar150;
    local_360._24_8_ = uVar150;
    auVar89 = vshufps_avx(local_800,local_800,0xff);
    local_380 = vbroadcastsd_avx512vl(auVar89);
    auVar89 = vshufps_avx512vl(local_810,local_810,0xff);
    local_3a0 = vbroadcastsd_avx512vl(auVar89);
    auVar89 = vshufps_avx512vl(_local_690,_local_690,0xff);
    uVar150 = auVar89._0_8_;
    register0x000012c8 = uVar150;
    local_3c0 = uVar150;
    register0x000012d0 = uVar150;
    register0x000012d8 = uVar150;
    auVar103 = vmulps_avx512vl(_local_3c0,auVar108);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar109,local_3a0);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar111,local_380);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar110,local_360);
    auVar104 = vmulps_avx512vl(_local_3c0,auVar106);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar107,local_3a0);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar97,local_380);
    auVar84 = vfmadd231ps_fma(auVar104,auVar96,local_360);
    auVar104 = vmulps_avx512vl(auVar101,auVar101);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar100,auVar100);
    auVar105 = vmaxps_avx512vl(auVar103,ZEXT1632(auVar84));
    auVar105 = vmulps_avx512vl(auVar105,auVar105);
    auVar104 = vmulps_avx512vl(auVar105,auVar104);
    auVar102 = vmulps_avx512vl(auVar102,auVar102);
    uVar150 = vcmpps_avx512vl(auVar102,auVar104,2);
    auVar89 = vblendps_avx(auVar90,local_7f0,8);
    auVar91 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar94 = vandps_avx512vl(auVar89,auVar91);
    auVar89 = vblendps_avx(auVar27,local_800,8);
    auVar89 = vandps_avx512vl(auVar89,auVar91);
    auVar94 = vmaxps_avx(auVar94,auVar89);
    auVar89 = vblendps_avx(auVar85,local_810,8);
    auVar86 = vandps_avx512vl(auVar89,auVar91);
    auVar89 = vblendps_avx(auVar81,_local_690,8);
    auVar89 = vandps_avx512vl(auVar89,auVar91);
    auVar89 = vmaxps_avx(auVar86,auVar89);
    auVar89 = vmaxps_avx(auVar94,auVar89);
    auVar94 = vmovshdup_avx(auVar89);
    auVar94 = vmaxss_avx(auVar94,auVar89);
    auVar89 = vshufpd_avx(auVar89,auVar89,1);
    auVar91 = vcvtsi2ss_avx512f(_local_690,iVar7);
    auVar89 = vmaxss_avx(auVar89,auVar94);
    local_480._0_16_ = auVar91;
    fVar159 = auVar91._0_4_;
    auVar104._4_4_ = fVar159;
    auVar104._0_4_ = fVar159;
    auVar104._8_4_ = fVar159;
    auVar104._12_4_ = fVar159;
    auVar104._16_4_ = fVar159;
    auVar104._20_4_ = fVar159;
    auVar104._24_4_ = fVar159;
    auVar104._28_4_ = fVar159;
    uVar30 = vcmpps_avx512vl(auVar104,_DAT_01f7b060,0xe);
    bVar73 = (byte)uVar150 & (byte)uVar30;
    auVar89 = vmulss_avx512f(auVar89,ZEXT416(0x35000000));
    auVar102._8_4_ = 2;
    auVar102._0_8_ = 0x200000002;
    auVar102._12_4_ = 2;
    auVar102._16_4_ = 2;
    auVar102._20_4_ = 2;
    auVar102._24_4_ = 2;
    auVar102._28_4_ = 2;
    local_3e0 = vpermps_avx512vl(auVar102,ZEXT1632(auVar90));
    local_400 = vpermps_avx512vl(auVar102,ZEXT1632(auVar27));
    local_420 = vpermps_avx512vl(auVar102,ZEXT1632(auVar85));
    local_780 = vpermps_avx2(auVar102,ZEXT1632(auVar81));
    auVar148 = vpbroadcastd_avx512f();
    local_300 = vmovdqa64_avx512f(auVar148);
    uVar178 = *(uint *)(ray + k * 4 + 0xc0);
    auVar94 = local_3e0._0_16_;
    if (bVar73 == 0) {
      bVar69 = false;
      auVar110 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar195 = ZEXT3264(auVar110);
      auVar94 = vxorps_avx512vl(auVar94,auVar94);
      auVar196 = ZEXT1664(auVar94);
      auVar197 = ZEXT3264(local_700);
      auVar198 = ZEXT3264(local_6e0);
      auVar194 = ZEXT3264(local_840);
      auVar148 = ZEXT3264(local_860);
      auVar199 = ZEXT3264(local_7a0);
      auVar201 = ZEXT3264(local_720);
    }
    else {
      local_740._0_16_ = ZEXT416(uVar178);
      local_6c0._0_16_ = auVar89;
      auVar106 = vmulps_avx512vl(local_780,auVar106);
      auVar107 = vfmadd213ps_avx512vl(auVar107,local_420,auVar106);
      auVar97 = vfmadd213ps_avx512vl(auVar97,local_400,auVar107);
      auVar106 = vfmadd213ps_avx512vl(auVar96,local_3e0,auVar97);
      auVar108 = vmulps_avx512vl(local_780,auVar108);
      auVar109 = vfmadd213ps_avx512vl(auVar109,local_420,auVar108);
      auVar97 = vfmadd213ps_avx512vl(auVar111,local_400,auVar109);
      auVar111 = *(undefined1 (*) [32])(bspline_basis0 + lVar65 + 0x1210);
      auVar109 = *(undefined1 (*) [32])(bspline_basis0 + lVar65 + 0x1694);
      auVar108 = *(undefined1 (*) [32])(bspline_basis0 + lVar65 + 0x1b18);
      auVar96 = *(undefined1 (*) [32])(bspline_basis0 + lVar65 + 0x1f9c);
      auVar102 = vfmadd213ps_avx512vl(auVar110,local_3e0,auVar97);
      auVar110 = vmulps_avx512vl(local_7c0,auVar96);
      auVar97 = vmulps_avx512vl(local_7e0,auVar96);
      auVar96 = vmulps_avx512vl(local_780,auVar96);
      auVar110 = vfmadd231ps_avx512vl(auVar110,auVar108,local_7a0);
      auVar91 = vfmadd231ps_fma(auVar97,auVar108,local_720);
      auVar108 = vfmadd231ps_avx512vl(auVar96,local_420,auVar108);
      auVar90 = vfmadd231ps_fma(auVar110,auVar109,local_840);
      auVar110 = vfmadd231ps_avx512vl(ZEXT1632(auVar91),auVar109,local_860);
      auVar96 = vfmadd231ps_avx512vl(auVar108,local_400,auVar109);
      auVar97 = vfmadd231ps_avx512vl(ZEXT1632(auVar90),auVar111,local_700);
      auVar107 = vfmadd231ps_avx512vl(auVar110,auVar111,local_6e0);
      auVar110 = *(undefined1 (*) [32])(bspline_basis1 + lVar65 + 0x1210);
      auVar109 = *(undefined1 (*) [32])(bspline_basis1 + lVar65 + 0x1b18);
      auVar108 = *(undefined1 (*) [32])(bspline_basis1 + lVar65 + 0x1f9c);
      auVar96 = vfmadd231ps_avx512vl(auVar96,local_3e0,auVar111);
      auVar111 = vmulps_avx512vl(local_7c0,auVar108);
      auVar104 = vmulps_avx512vl(local_7e0,auVar108);
      auVar108 = vmulps_avx512vl(local_780,auVar108);
      auVar203 = ZEXT1664(auVar89);
      auVar105 = vfmadd231ps_avx512vl(auVar111,auVar109,local_7a0);
      auVar91 = vfmadd231ps_fma(auVar104,auVar109,local_720);
      auVar201 = ZEXT3264(local_720);
      auVar109 = vfmadd231ps_avx512vl(auVar108,local_420,auVar109);
      auVar111 = *(undefined1 (*) [32])(bspline_basis1 + lVar65 + 0x1694);
      auVar108 = vfmadd231ps_avx512vl(auVar105,auVar111,local_840);
      auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar91),auVar111,local_860);
      auVar111 = vfmadd231ps_avx512vl(auVar109,local_400,auVar111);
      auVar109 = vfmadd231ps_avx512vl(auVar108,auVar110,local_700);
      auVar108 = vfmadd231ps_avx512vl(auVar104,auVar110,local_6e0);
      auVar104 = vfmadd231ps_avx512vl(auVar111,local_3e0,auVar110);
      auVar192._8_4_ = 0x7fffffff;
      auVar192._0_8_ = 0x7fffffff7fffffff;
      auVar192._12_4_ = 0x7fffffff;
      auVar192._16_4_ = 0x7fffffff;
      auVar192._20_4_ = 0x7fffffff;
      auVar192._24_4_ = 0x7fffffff;
      auVar192._28_4_ = 0x7fffffff;
      auVar110 = vandps_avx(auVar97,auVar192);
      auVar111 = vandps_avx(auVar107,auVar192);
      auVar111 = vmaxps_avx(auVar110,auVar111);
      auVar110 = vandps_avx(auVar96,auVar192);
      auVar110 = vmaxps_avx(auVar111,auVar110);
      auVar96 = vbroadcastss_avx512vl(auVar89);
      uVar64 = vcmpps_avx512vl(auVar110,auVar96,1);
      bVar69 = (bool)((byte)uVar64 & 1);
      auVar105._0_4_ = (float)((uint)bVar69 * auVar100._0_4_ | (uint)!bVar69 * auVar97._0_4_);
      bVar69 = (bool)((byte)(uVar64 >> 1) & 1);
      auVar105._4_4_ = (float)((uint)bVar69 * auVar100._4_4_ | (uint)!bVar69 * auVar97._4_4_);
      bVar69 = (bool)((byte)(uVar64 >> 2) & 1);
      auVar105._8_4_ = (float)((uint)bVar69 * auVar100._8_4_ | (uint)!bVar69 * auVar97._8_4_);
      bVar69 = (bool)((byte)(uVar64 >> 3) & 1);
      auVar105._12_4_ = (float)((uint)bVar69 * auVar100._12_4_ | (uint)!bVar69 * auVar97._12_4_);
      bVar69 = (bool)((byte)(uVar64 >> 4) & 1);
      auVar105._16_4_ = (float)((uint)bVar69 * auVar100._16_4_ | (uint)!bVar69 * auVar97._16_4_);
      bVar69 = (bool)((byte)(uVar64 >> 5) & 1);
      auVar105._20_4_ = (float)((uint)bVar69 * auVar100._20_4_ | (uint)!bVar69 * auVar97._20_4_);
      bVar69 = (bool)((byte)(uVar64 >> 6) & 1);
      auVar105._24_4_ = (float)((uint)bVar69 * auVar100._24_4_ | (uint)!bVar69 * auVar97._24_4_);
      bVar69 = SUB81(uVar64 >> 7,0);
      auVar105._28_4_ = (uint)bVar69 * auVar100._28_4_ | (uint)!bVar69 * auVar97._28_4_;
      bVar69 = (bool)((byte)uVar64 & 1);
      auVar121._0_4_ = (float)((uint)bVar69 * auVar101._0_4_ | (uint)!bVar69 * auVar107._0_4_);
      bVar69 = (bool)((byte)(uVar64 >> 1) & 1);
      auVar121._4_4_ = (float)((uint)bVar69 * auVar101._4_4_ | (uint)!bVar69 * auVar107._4_4_);
      bVar69 = (bool)((byte)(uVar64 >> 2) & 1);
      auVar121._8_4_ = (float)((uint)bVar69 * auVar101._8_4_ | (uint)!bVar69 * auVar107._8_4_);
      bVar69 = (bool)((byte)(uVar64 >> 3) & 1);
      auVar121._12_4_ = (float)((uint)bVar69 * auVar101._12_4_ | (uint)!bVar69 * auVar107._12_4_);
      bVar69 = (bool)((byte)(uVar64 >> 4) & 1);
      auVar121._16_4_ = (float)((uint)bVar69 * auVar101._16_4_ | (uint)!bVar69 * auVar107._16_4_);
      bVar69 = (bool)((byte)(uVar64 >> 5) & 1);
      auVar121._20_4_ = (float)((uint)bVar69 * auVar101._20_4_ | (uint)!bVar69 * auVar107._20_4_);
      bVar69 = (bool)((byte)(uVar64 >> 6) & 1);
      auVar121._24_4_ = (float)((uint)bVar69 * auVar101._24_4_ | (uint)!bVar69 * auVar107._24_4_);
      bVar69 = SUB81(uVar64 >> 7,0);
      auVar121._28_4_ = (uint)bVar69 * auVar101._28_4_ | (uint)!bVar69 * auVar107._28_4_;
      auVar110 = vandps_avx(auVar192,auVar109);
      auVar111 = vandps_avx(auVar108,auVar192);
      auVar111 = vmaxps_avx(auVar110,auVar111);
      auVar110 = vandps_avx(auVar104,auVar192);
      auVar110 = vmaxps_avx(auVar111,auVar110);
      uVar64 = vcmpps_avx512vl(auVar110,auVar96,1);
      bVar69 = (bool)((byte)uVar64 & 1);
      auVar112._0_4_ = (float)((uint)bVar69 * auVar100._0_4_ | (uint)!bVar69 * auVar109._0_4_);
      bVar69 = (bool)((byte)(uVar64 >> 1) & 1);
      auVar112._4_4_ = (float)((uint)bVar69 * auVar100._4_4_ | (uint)!bVar69 * auVar109._4_4_);
      bVar69 = (bool)((byte)(uVar64 >> 2) & 1);
      auVar112._8_4_ = (float)((uint)bVar69 * auVar100._8_4_ | (uint)!bVar69 * auVar109._8_4_);
      bVar69 = (bool)((byte)(uVar64 >> 3) & 1);
      auVar112._12_4_ = (float)((uint)bVar69 * auVar100._12_4_ | (uint)!bVar69 * auVar109._12_4_);
      bVar69 = (bool)((byte)(uVar64 >> 4) & 1);
      auVar112._16_4_ = (float)((uint)bVar69 * auVar100._16_4_ | (uint)!bVar69 * auVar109._16_4_);
      bVar69 = (bool)((byte)(uVar64 >> 5) & 1);
      auVar112._20_4_ = (float)((uint)bVar69 * auVar100._20_4_ | (uint)!bVar69 * auVar109._20_4_);
      bVar69 = (bool)((byte)(uVar64 >> 6) & 1);
      auVar112._24_4_ = (float)((uint)bVar69 * auVar100._24_4_ | (uint)!bVar69 * auVar109._24_4_);
      bVar69 = SUB81(uVar64 >> 7,0);
      auVar112._28_4_ = (uint)bVar69 * auVar100._28_4_ | (uint)!bVar69 * auVar109._28_4_;
      bVar69 = (bool)((byte)uVar64 & 1);
      auVar113._0_4_ = (float)((uint)bVar69 * auVar101._0_4_ | (uint)!bVar69 * auVar108._0_4_);
      bVar69 = (bool)((byte)(uVar64 >> 1) & 1);
      auVar113._4_4_ = (float)((uint)bVar69 * auVar101._4_4_ | (uint)!bVar69 * auVar108._4_4_);
      bVar69 = (bool)((byte)(uVar64 >> 2) & 1);
      auVar113._8_4_ = (float)((uint)bVar69 * auVar101._8_4_ | (uint)!bVar69 * auVar108._8_4_);
      bVar69 = (bool)((byte)(uVar64 >> 3) & 1);
      auVar113._12_4_ = (float)((uint)bVar69 * auVar101._12_4_ | (uint)!bVar69 * auVar108._12_4_);
      bVar69 = (bool)((byte)(uVar64 >> 4) & 1);
      auVar113._16_4_ = (float)((uint)bVar69 * auVar101._16_4_ | (uint)!bVar69 * auVar108._16_4_);
      bVar69 = (bool)((byte)(uVar64 >> 5) & 1);
      auVar113._20_4_ = (float)((uint)bVar69 * auVar101._20_4_ | (uint)!bVar69 * auVar108._20_4_);
      bVar69 = (bool)((byte)(uVar64 >> 6) & 1);
      auVar113._24_4_ = (float)((uint)bVar69 * auVar101._24_4_ | (uint)!bVar69 * auVar108._24_4_);
      bVar69 = SUB81(uVar64 >> 7,0);
      auVar113._28_4_ = (uint)bVar69 * auVar101._28_4_ | (uint)!bVar69 * auVar108._28_4_;
      auVar95 = vxorps_avx512vl(auVar94,auVar94);
      auVar196 = ZEXT1664(auVar95);
      auVar110 = vfmadd213ps_avx512vl(auVar105,auVar105,ZEXT1632(auVar95));
      auVar94 = vfmadd231ps_fma(auVar110,auVar121,auVar121);
      auVar109 = vrsqrt14ps_avx512vl(ZEXT1632(auVar94));
      fVar177 = auVar109._0_4_;
      fVar180 = auVar109._4_4_;
      fVar149 = auVar109._8_4_;
      fVar174 = auVar109._12_4_;
      fVar173 = auVar109._16_4_;
      fVar175 = auVar109._20_4_;
      fVar74 = auVar109._24_4_;
      auVar110._4_4_ = fVar180 * fVar180 * fVar180 * auVar94._4_4_ * -0.5;
      auVar110._0_4_ = fVar177 * fVar177 * fVar177 * auVar94._0_4_ * -0.5;
      auVar110._8_4_ = fVar149 * fVar149 * fVar149 * auVar94._8_4_ * -0.5;
      auVar110._12_4_ = fVar174 * fVar174 * fVar174 * auVar94._12_4_ * -0.5;
      auVar110._16_4_ = fVar173 * fVar173 * fVar173 * -0.0;
      auVar110._20_4_ = fVar175 * fVar175 * fVar175 * -0.0;
      auVar110._24_4_ = fVar74 * fVar74 * fVar74 * -0.0;
      auVar110._28_4_ = 0;
      auVar96 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
      auVar110 = vfmadd231ps_avx512vl(auVar110,auVar96,auVar109);
      auVar111._4_4_ = auVar121._4_4_ * auVar110._4_4_;
      auVar111._0_4_ = auVar121._0_4_ * auVar110._0_4_;
      auVar111._8_4_ = auVar121._8_4_ * auVar110._8_4_;
      auVar111._12_4_ = auVar121._12_4_ * auVar110._12_4_;
      auVar111._16_4_ = auVar121._16_4_ * auVar110._16_4_;
      auVar111._20_4_ = auVar121._20_4_ * auVar110._20_4_;
      auVar111._24_4_ = auVar121._24_4_ * auVar110._24_4_;
      auVar111._28_4_ = auVar109._28_4_;
      auVar109._4_4_ = auVar110._4_4_ * -auVar105._4_4_;
      auVar109._0_4_ = auVar110._0_4_ * -auVar105._0_4_;
      auVar109._8_4_ = auVar110._8_4_ * -auVar105._8_4_;
      auVar109._12_4_ = auVar110._12_4_ * -auVar105._12_4_;
      auVar109._16_4_ = auVar110._16_4_ * -auVar105._16_4_;
      auVar109._20_4_ = auVar110._20_4_ * -auVar105._20_4_;
      auVar109._24_4_ = auVar110._24_4_ * -auVar105._24_4_;
      auVar109._28_4_ = auVar105._28_4_ ^ 0x80000000;
      auVar100 = vmulps_avx512vl(auVar110,ZEXT1632(auVar95));
      auVar101 = ZEXT1632(auVar95);
      auVar108 = vfmadd213ps_avx512vl(auVar112,auVar112,auVar101);
      auVar94 = vfmadd231ps_fma(auVar108,auVar113,auVar113);
      auVar107 = vrsqrt14ps_avx512vl(ZEXT1632(auVar94));
      fVar177 = auVar107._0_4_;
      fVar180 = auVar107._4_4_;
      fVar149 = auVar107._8_4_;
      fVar174 = auVar107._12_4_;
      fVar173 = auVar107._16_4_;
      fVar175 = auVar107._20_4_;
      fVar74 = auVar107._24_4_;
      auVar108._4_4_ = fVar180 * fVar180 * fVar180 * auVar94._4_4_ * -0.5;
      auVar108._0_4_ = fVar177 * fVar177 * fVar177 * auVar94._0_4_ * -0.5;
      auVar108._8_4_ = fVar149 * fVar149 * fVar149 * auVar94._8_4_ * -0.5;
      auVar108._12_4_ = fVar174 * fVar174 * fVar174 * auVar94._12_4_ * -0.5;
      auVar108._16_4_ = fVar173 * fVar173 * fVar173 * -0.0;
      auVar108._20_4_ = fVar175 * fVar175 * fVar175 * -0.0;
      auVar108._24_4_ = fVar74 * fVar74 * fVar74 * -0.0;
      auVar108._28_4_ = 0;
      auVar108 = vfmadd231ps_avx512vl(auVar108,auVar96,auVar107);
      auVar97._4_4_ = auVar113._4_4_ * auVar108._4_4_;
      auVar97._0_4_ = auVar113._0_4_ * auVar108._0_4_;
      auVar97._8_4_ = auVar113._8_4_ * auVar108._8_4_;
      auVar97._12_4_ = auVar113._12_4_ * auVar108._12_4_;
      auVar97._16_4_ = auVar113._16_4_ * auVar108._16_4_;
      auVar97._20_4_ = auVar113._20_4_ * auVar108._20_4_;
      auVar97._24_4_ = auVar113._24_4_ * auVar108._24_4_;
      auVar97._28_4_ = auVar107._28_4_;
      auVar107._4_4_ = -auVar112._4_4_ * auVar108._4_4_;
      auVar107._0_4_ = -auVar112._0_4_ * auVar108._0_4_;
      auVar107._8_4_ = -auVar112._8_4_ * auVar108._8_4_;
      auVar107._12_4_ = -auVar112._12_4_ * auVar108._12_4_;
      auVar107._16_4_ = -auVar112._16_4_ * auVar108._16_4_;
      auVar107._20_4_ = -auVar112._20_4_ * auVar108._20_4_;
      auVar107._24_4_ = -auVar112._24_4_ * auVar108._24_4_;
      auVar107._28_4_ = auVar110._28_4_;
      auVar110 = vmulps_avx512vl(auVar108,auVar101);
      auVar94 = vfmadd213ps_fma(auVar111,auVar103,auVar98);
      auVar91 = vfmadd213ps_fma(auVar109,auVar103,auVar99);
      auVar108 = vfmadd213ps_avx512vl(auVar100,auVar103,auVar102);
      auVar96 = vfmadd213ps_avx512vl(auVar97,ZEXT1632(auVar84),ZEXT1632(auVar82));
      auVar86 = vfnmadd213ps_fma(auVar111,auVar103,auVar98);
      auVar98 = ZEXT1632(auVar84);
      auVar90 = vfmadd213ps_fma(auVar107,auVar98,ZEXT1632(auVar83));
      auVar87 = vfnmadd213ps_fma(auVar109,auVar103,auVar99);
      auVar27 = vfmadd213ps_fma(auVar110,auVar98,auVar106);
      auVar111 = vfnmadd231ps_avx512vl(auVar102,auVar103,auVar100);
      auVar82 = vfnmadd213ps_fma(auVar97,auVar98,ZEXT1632(auVar82));
      auVar83 = vfnmadd213ps_fma(auVar107,auVar98,ZEXT1632(auVar83));
      auVar88 = vfnmadd231ps_fma(auVar106,ZEXT1632(auVar84),auVar110);
      auVar109 = vsubps_avx512vl(auVar96,ZEXT1632(auVar86));
      auVar110 = vsubps_avx(ZEXT1632(auVar90),ZEXT1632(auVar87));
      auVar97 = vsubps_avx512vl(ZEXT1632(auVar27),auVar111);
      auVar107 = vmulps_avx512vl(auVar110,auVar111);
      auVar85 = vfmsub231ps_fma(auVar107,ZEXT1632(auVar87),auVar97);
      auVar106._4_4_ = auVar86._4_4_ * auVar97._4_4_;
      auVar106._0_4_ = auVar86._0_4_ * auVar97._0_4_;
      auVar106._8_4_ = auVar86._8_4_ * auVar97._8_4_;
      auVar106._12_4_ = auVar86._12_4_ * auVar97._12_4_;
      auVar106._16_4_ = auVar97._16_4_ * 0.0;
      auVar106._20_4_ = auVar97._20_4_ * 0.0;
      auVar106._24_4_ = auVar97._24_4_ * 0.0;
      auVar106._28_4_ = auVar97._28_4_;
      auVar97 = vfmsub231ps_avx512vl(auVar106,auVar111,auVar109);
      auVar98._4_4_ = auVar87._4_4_ * auVar109._4_4_;
      auVar98._0_4_ = auVar87._0_4_ * auVar109._0_4_;
      auVar98._8_4_ = auVar87._8_4_ * auVar109._8_4_;
      auVar98._12_4_ = auVar87._12_4_ * auVar109._12_4_;
      auVar98._16_4_ = auVar109._16_4_ * 0.0;
      auVar98._20_4_ = auVar109._20_4_ * 0.0;
      auVar98._24_4_ = auVar109._24_4_ * 0.0;
      auVar98._28_4_ = auVar109._28_4_;
      auVar81 = vfmsub231ps_fma(auVar98,ZEXT1632(auVar86),auVar110);
      auVar110 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar101,auVar97);
      auVar110 = vfmadd231ps_avx512vl(auVar110,auVar101,ZEXT1632(auVar85));
      auVar102 = ZEXT1632(auVar95);
      uVar64 = vcmpps_avx512vl(auVar110,auVar102,2);
      bVar63 = (byte)uVar64;
      fVar74 = (float)((uint)(bVar63 & 1) * auVar94._0_4_ |
                      (uint)!(bool)(bVar63 & 1) * auVar82._0_4_);
      bVar69 = (bool)((byte)(uVar64 >> 1) & 1);
      fVar134 = (float)((uint)bVar69 * auVar94._4_4_ | (uint)!bVar69 * auVar82._4_4_);
      bVar69 = (bool)((byte)(uVar64 >> 2) & 1);
      fVar136 = (float)((uint)bVar69 * auVar94._8_4_ | (uint)!bVar69 * auVar82._8_4_);
      bVar69 = (bool)((byte)(uVar64 >> 3) & 1);
      fVar138 = (float)((uint)bVar69 * auVar94._12_4_ | (uint)!bVar69 * auVar82._12_4_);
      auVar107 = ZEXT1632(CONCAT412(fVar138,CONCAT48(fVar136,CONCAT44(fVar134,fVar74))));
      fVar75 = (float)((uint)(bVar63 & 1) * auVar91._0_4_ |
                      (uint)!(bool)(bVar63 & 1) * auVar83._0_4_);
      bVar69 = (bool)((byte)(uVar64 >> 1) & 1);
      fVar135 = (float)((uint)bVar69 * auVar91._4_4_ | (uint)!bVar69 * auVar83._4_4_);
      bVar69 = (bool)((byte)(uVar64 >> 2) & 1);
      fVar137 = (float)((uint)bVar69 * auVar91._8_4_ | (uint)!bVar69 * auVar83._8_4_);
      bVar69 = (bool)((byte)(uVar64 >> 3) & 1);
      fVar139 = (float)((uint)bVar69 * auVar91._12_4_ | (uint)!bVar69 * auVar83._12_4_);
      auVar106 = ZEXT1632(CONCAT412(fVar139,CONCAT48(fVar137,CONCAT44(fVar135,fVar75))));
      auVar114._0_4_ =
           (float)((uint)(bVar63 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar88._0_4_);
      bVar69 = (bool)((byte)(uVar64 >> 1) & 1);
      auVar114._4_4_ = (float)((uint)bVar69 * auVar108._4_4_ | (uint)!bVar69 * auVar88._4_4_);
      bVar69 = (bool)((byte)(uVar64 >> 2) & 1);
      auVar114._8_4_ = (float)((uint)bVar69 * auVar108._8_4_ | (uint)!bVar69 * auVar88._8_4_);
      bVar69 = (bool)((byte)(uVar64 >> 3) & 1);
      auVar114._12_4_ = (float)((uint)bVar69 * auVar108._12_4_ | (uint)!bVar69 * auVar88._12_4_);
      fVar180 = (float)((uint)((byte)(uVar64 >> 4) & 1) * auVar108._16_4_);
      auVar114._16_4_ = fVar180;
      fVar177 = (float)((uint)((byte)(uVar64 >> 5) & 1) * auVar108._20_4_);
      auVar114._20_4_ = fVar177;
      fVar149 = (float)((uint)((byte)(uVar64 >> 6) & 1) * auVar108._24_4_);
      auVar114._24_4_ = fVar149;
      iVar1 = (uint)(byte)(uVar64 >> 7) * auVar108._28_4_;
      auVar114._28_4_ = iVar1;
      auVar109 = vblendmps_avx512vl(ZEXT1632(auVar86),auVar96);
      auVar115._0_4_ =
           (uint)(bVar63 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar91._0_4_;
      bVar69 = (bool)((byte)(uVar64 >> 1) & 1);
      auVar115._4_4_ = (uint)bVar69 * auVar109._4_4_ | (uint)!bVar69 * auVar91._4_4_;
      bVar69 = (bool)((byte)(uVar64 >> 2) & 1);
      auVar115._8_4_ = (uint)bVar69 * auVar109._8_4_ | (uint)!bVar69 * auVar91._8_4_;
      bVar69 = (bool)((byte)(uVar64 >> 3) & 1);
      auVar115._12_4_ = (uint)bVar69 * auVar109._12_4_ | (uint)!bVar69 * auVar91._12_4_;
      auVar115._16_4_ = (uint)((byte)(uVar64 >> 4) & 1) * auVar109._16_4_;
      auVar115._20_4_ = (uint)((byte)(uVar64 >> 5) & 1) * auVar109._20_4_;
      auVar115._24_4_ = (uint)((byte)(uVar64 >> 6) & 1) * auVar109._24_4_;
      auVar115._28_4_ = (uint)(byte)(uVar64 >> 7) * auVar109._28_4_;
      auVar109 = vblendmps_avx512vl(ZEXT1632(auVar87),ZEXT1632(auVar90));
      auVar116._0_4_ =
           (float)((uint)(bVar63 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar85._0_4_);
      bVar69 = (bool)((byte)(uVar64 >> 1) & 1);
      auVar116._4_4_ = (float)((uint)bVar69 * auVar109._4_4_ | (uint)!bVar69 * auVar85._4_4_);
      bVar69 = (bool)((byte)(uVar64 >> 2) & 1);
      auVar116._8_4_ = (float)((uint)bVar69 * auVar109._8_4_ | (uint)!bVar69 * auVar85._8_4_);
      bVar69 = (bool)((byte)(uVar64 >> 3) & 1);
      auVar116._12_4_ = (float)((uint)bVar69 * auVar109._12_4_ | (uint)!bVar69 * auVar85._12_4_);
      fVar174 = (float)((uint)((byte)(uVar64 >> 4) & 1) * auVar109._16_4_);
      auVar116._16_4_ = fVar174;
      fVar173 = (float)((uint)((byte)(uVar64 >> 5) & 1) * auVar109._20_4_);
      auVar116._20_4_ = fVar173;
      fVar175 = (float)((uint)((byte)(uVar64 >> 6) & 1) * auVar109._24_4_);
      auVar116._24_4_ = fVar175;
      auVar116._28_4_ = (uint)(byte)(uVar64 >> 7) * auVar109._28_4_;
      auVar109 = vblendmps_avx512vl(auVar111,ZEXT1632(auVar27));
      auVar117._0_4_ =
           (float)((uint)(bVar63 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar108._0_4_)
      ;
      bVar69 = (bool)((byte)(uVar64 >> 1) & 1);
      auVar117._4_4_ = (float)((uint)bVar69 * auVar109._4_4_ | (uint)!bVar69 * auVar108._4_4_);
      bVar69 = (bool)((byte)(uVar64 >> 2) & 1);
      auVar117._8_4_ = (float)((uint)bVar69 * auVar109._8_4_ | (uint)!bVar69 * auVar108._8_4_);
      bVar69 = (bool)((byte)(uVar64 >> 3) & 1);
      auVar117._12_4_ = (float)((uint)bVar69 * auVar109._12_4_ | (uint)!bVar69 * auVar108._12_4_);
      bVar69 = (bool)((byte)(uVar64 >> 4) & 1);
      auVar117._16_4_ = (float)((uint)bVar69 * auVar109._16_4_ | (uint)!bVar69 * auVar108._16_4_);
      bVar69 = (bool)((byte)(uVar64 >> 5) & 1);
      auVar117._20_4_ = (float)((uint)bVar69 * auVar109._20_4_ | (uint)!bVar69 * auVar108._20_4_);
      bVar69 = (bool)((byte)(uVar64 >> 6) & 1);
      auVar117._24_4_ = (float)((uint)bVar69 * auVar109._24_4_ | (uint)!bVar69 * auVar108._24_4_);
      bVar69 = SUB81(uVar64 >> 7,0);
      auVar117._28_4_ = (uint)bVar69 * auVar109._28_4_ | (uint)!bVar69 * auVar108._28_4_;
      auVar118._0_4_ =
           (uint)(bVar63 & 1) * (int)auVar86._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar96._0_4_;
      bVar69 = (bool)((byte)(uVar64 >> 1) & 1);
      auVar118._4_4_ = (uint)bVar69 * (int)auVar86._4_4_ | (uint)!bVar69 * auVar96._4_4_;
      bVar69 = (bool)((byte)(uVar64 >> 2) & 1);
      auVar118._8_4_ = (uint)bVar69 * (int)auVar86._8_4_ | (uint)!bVar69 * auVar96._8_4_;
      bVar69 = (bool)((byte)(uVar64 >> 3) & 1);
      auVar118._12_4_ = (uint)bVar69 * (int)auVar86._12_4_ | (uint)!bVar69 * auVar96._12_4_;
      auVar118._16_4_ = (uint)!(bool)((byte)(uVar64 >> 4) & 1) * auVar96._16_4_;
      auVar118._20_4_ = (uint)!(bool)((byte)(uVar64 >> 5) & 1) * auVar96._20_4_;
      auVar118._24_4_ = (uint)!(bool)((byte)(uVar64 >> 6) & 1) * auVar96._24_4_;
      auVar118._28_4_ = (uint)!SUB81(uVar64 >> 7,0) * auVar96._28_4_;
      bVar69 = (bool)((byte)(uVar64 >> 1) & 1);
      bVar13 = (bool)((byte)(uVar64 >> 2) & 1);
      bVar14 = (bool)((byte)(uVar64 >> 3) & 1);
      auVar119._0_4_ =
           (uint)(bVar63 & 1) * auVar111._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar27._0_4_;
      bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
      auVar119._4_4_ = (uint)bVar12 * auVar111._4_4_ | (uint)!bVar12 * auVar27._4_4_;
      bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
      auVar119._8_4_ = (uint)bVar12 * auVar111._8_4_ | (uint)!bVar12 * auVar27._8_4_;
      bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
      auVar119._12_4_ = (uint)bVar12 * auVar111._12_4_ | (uint)!bVar12 * auVar27._12_4_;
      auVar119._16_4_ = (uint)((byte)(uVar64 >> 4) & 1) * auVar111._16_4_;
      auVar119._20_4_ = (uint)((byte)(uVar64 >> 5) & 1) * auVar111._20_4_;
      auVar119._24_4_ = (uint)((byte)(uVar64 >> 6) & 1) * auVar111._24_4_;
      iVar2 = (uint)(byte)(uVar64 >> 7) * auVar111._28_4_;
      auVar119._28_4_ = iVar2;
      auVar98 = vsubps_avx512vl(auVar118,auVar107);
      auVar111 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar14 * (int)auVar87._12_4_ |
                                               (uint)!bVar14 * auVar90._12_4_,
                                               CONCAT48((uint)bVar13 * (int)auVar87._8_4_ |
                                                        (uint)!bVar13 * auVar90._8_4_,
                                                        CONCAT44((uint)bVar69 * (int)auVar87._4_4_ |
                                                                 (uint)!bVar69 * auVar90._4_4_,
                                                                 (uint)(bVar63 & 1) *
                                                                 (int)auVar87._0_4_ |
                                                                 (uint)!(bool)(bVar63 & 1) *
                                                                 auVar90._0_4_)))),auVar106);
      auVar109 = vsubps_avx(auVar119,auVar114);
      auVar108 = vsubps_avx(auVar107,auVar115);
      auVar96 = vsubps_avx(auVar106,auVar116);
      auVar97 = vsubps_avx(auVar114,auVar117);
      auVar99._4_4_ = auVar109._4_4_ * fVar134;
      auVar99._0_4_ = auVar109._0_4_ * fVar74;
      auVar99._8_4_ = auVar109._8_4_ * fVar136;
      auVar99._12_4_ = auVar109._12_4_ * fVar138;
      auVar99._16_4_ = auVar109._16_4_ * 0.0;
      auVar99._20_4_ = auVar109._20_4_ * 0.0;
      auVar99._24_4_ = auVar109._24_4_ * 0.0;
      auVar99._28_4_ = iVar2;
      auVar94 = vfmsub231ps_fma(auVar99,auVar114,auVar98);
      auVar100._4_4_ = fVar135 * auVar98._4_4_;
      auVar100._0_4_ = fVar75 * auVar98._0_4_;
      auVar100._8_4_ = fVar137 * auVar98._8_4_;
      auVar100._12_4_ = fVar139 * auVar98._12_4_;
      auVar100._16_4_ = auVar98._16_4_ * 0.0;
      auVar100._20_4_ = auVar98._20_4_ * 0.0;
      auVar100._24_4_ = auVar98._24_4_ * 0.0;
      auVar100._28_4_ = auVar110._28_4_;
      auVar91 = vfmsub231ps_fma(auVar100,auVar107,auVar111);
      auVar110 = vfmadd231ps_avx512vl(ZEXT1632(auVar91),auVar102,ZEXT1632(auVar94));
      auVar166._0_4_ = auVar111._0_4_ * auVar114._0_4_;
      auVar166._4_4_ = auVar111._4_4_ * auVar114._4_4_;
      auVar166._8_4_ = auVar111._8_4_ * auVar114._8_4_;
      auVar166._12_4_ = auVar111._12_4_ * auVar114._12_4_;
      auVar166._16_4_ = auVar111._16_4_ * fVar180;
      auVar166._20_4_ = auVar111._20_4_ * fVar177;
      auVar166._24_4_ = auVar111._24_4_ * fVar149;
      auVar166._28_4_ = 0;
      auVar94 = vfmsub231ps_fma(auVar166,auVar106,auVar109);
      auVar99 = vfmadd231ps_avx512vl(auVar110,auVar102,ZEXT1632(auVar94));
      auVar110 = vmulps_avx512vl(auVar97,auVar115);
      auVar110 = vfmsub231ps_avx512vl(auVar110,auVar108,auVar117);
      auVar101._4_4_ = auVar96._4_4_ * auVar117._4_4_;
      auVar101._0_4_ = auVar96._0_4_ * auVar117._0_4_;
      auVar101._8_4_ = auVar96._8_4_ * auVar117._8_4_;
      auVar101._12_4_ = auVar96._12_4_ * auVar117._12_4_;
      auVar101._16_4_ = auVar96._16_4_ * auVar117._16_4_;
      auVar101._20_4_ = auVar96._20_4_ * auVar117._20_4_;
      auVar101._24_4_ = auVar96._24_4_ * auVar117._24_4_;
      auVar101._28_4_ = auVar117._28_4_;
      auVar94 = vfmsub231ps_fma(auVar101,auVar116,auVar97);
      auVar167._0_4_ = auVar116._0_4_ * auVar108._0_4_;
      auVar167._4_4_ = auVar116._4_4_ * auVar108._4_4_;
      auVar167._8_4_ = auVar116._8_4_ * auVar108._8_4_;
      auVar167._12_4_ = auVar116._12_4_ * auVar108._12_4_;
      auVar167._16_4_ = fVar174 * auVar108._16_4_;
      auVar167._20_4_ = fVar173 * auVar108._20_4_;
      auVar167._24_4_ = fVar175 * auVar108._24_4_;
      auVar167._28_4_ = 0;
      auVar91 = vfmsub231ps_fma(auVar167,auVar96,auVar115);
      auVar110 = vfmadd231ps_avx512vl(ZEXT1632(auVar91),auVar102,auVar110);
      auVar100 = vfmadd231ps_avx512vl(auVar110,auVar102,ZEXT1632(auVar94));
      auVar110 = vmaxps_avx(auVar99,auVar100);
      uVar150 = vcmpps_avx512vl(auVar110,auVar102,2);
      bVar73 = bVar73 & (byte)uVar150;
      auVar197 = ZEXT3264(local_700);
      auVar198 = ZEXT3264(local_6e0);
      auVar194 = ZEXT3264(local_840);
      auVar148 = ZEXT3264(local_860);
      if (bVar73 == 0) {
        bVar69 = false;
        auVar110 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar195 = ZEXT3264(auVar110);
        auVar199 = ZEXT3264(local_7a0);
        auVar200 = ZEXT3264(local_7c0);
        auVar202 = ZEXT3264(local_7e0);
      }
      else {
        auVar39._4_4_ = auVar97._4_4_ * auVar111._4_4_;
        auVar39._0_4_ = auVar97._0_4_ * auVar111._0_4_;
        auVar39._8_4_ = auVar97._8_4_ * auVar111._8_4_;
        auVar39._12_4_ = auVar97._12_4_ * auVar111._12_4_;
        auVar39._16_4_ = auVar97._16_4_ * auVar111._16_4_;
        auVar39._20_4_ = auVar97._20_4_ * auVar111._20_4_;
        auVar39._24_4_ = auVar97._24_4_ * auVar111._24_4_;
        auVar39._28_4_ = auVar110._28_4_;
        auVar90 = vfmsub231ps_fma(auVar39,auVar96,auVar109);
        auVar40._4_4_ = auVar109._4_4_ * auVar108._4_4_;
        auVar40._0_4_ = auVar109._0_4_ * auVar108._0_4_;
        auVar40._8_4_ = auVar109._8_4_ * auVar108._8_4_;
        auVar40._12_4_ = auVar109._12_4_ * auVar108._12_4_;
        auVar40._16_4_ = auVar109._16_4_ * auVar108._16_4_;
        auVar40._20_4_ = auVar109._20_4_ * auVar108._20_4_;
        auVar40._24_4_ = auVar109._24_4_ * auVar108._24_4_;
        auVar40._28_4_ = auVar109._28_4_;
        auVar91 = vfmsub231ps_fma(auVar40,auVar98,auVar97);
        auVar41._4_4_ = auVar96._4_4_ * auVar98._4_4_;
        auVar41._0_4_ = auVar96._0_4_ * auVar98._0_4_;
        auVar41._8_4_ = auVar96._8_4_ * auVar98._8_4_;
        auVar41._12_4_ = auVar96._12_4_ * auVar98._12_4_;
        auVar41._16_4_ = auVar96._16_4_ * auVar98._16_4_;
        auVar41._20_4_ = auVar96._20_4_ * auVar98._20_4_;
        auVar41._24_4_ = auVar96._24_4_ * auVar98._24_4_;
        auVar41._28_4_ = auVar96._28_4_;
        auVar27 = vfmsub231ps_fma(auVar41,auVar108,auVar111);
        auVar94 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar91),ZEXT1632(auVar27));
        auVar110 = vfmadd231ps_avx512vl(ZEXT1632(auVar94),ZEXT1632(auVar90),auVar102);
        auVar111 = vrcp14ps_avx512vl(auVar110);
        auVar109 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar195 = ZEXT3264(auVar109);
        auVar108 = vfnmadd213ps_avx512vl(auVar111,auVar110,auVar109);
        auVar94 = vfmadd132ps_fma(auVar108,auVar111,auVar111);
        auVar42._4_4_ = auVar27._4_4_ * auVar114._4_4_;
        auVar42._0_4_ = auVar27._0_4_ * auVar114._0_4_;
        auVar42._8_4_ = auVar27._8_4_ * auVar114._8_4_;
        auVar42._12_4_ = auVar27._12_4_ * auVar114._12_4_;
        auVar42._16_4_ = fVar180 * 0.0;
        auVar42._20_4_ = fVar177 * 0.0;
        auVar42._24_4_ = fVar149 * 0.0;
        auVar42._28_4_ = iVar1;
        auVar91 = vfmadd231ps_fma(auVar42,auVar106,ZEXT1632(auVar91));
        auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar107,ZEXT1632(auVar90));
        fVar177 = auVar94._0_4_;
        fVar180 = auVar94._4_4_;
        fVar149 = auVar94._8_4_;
        fVar174 = auVar94._12_4_;
        local_5a0 = ZEXT1632(CONCAT412(auVar91._12_4_ * fVar174,
                                       CONCAT48(auVar91._8_4_ * fVar149,
                                                CONCAT44(auVar91._4_4_ * fVar180,
                                                         auVar91._0_4_ * fVar177))));
        auVar176._4_4_ = uVar178;
        auVar176._0_4_ = uVar178;
        auVar176._8_4_ = uVar178;
        auVar176._12_4_ = uVar178;
        auVar176._16_4_ = uVar178;
        auVar176._20_4_ = uVar178;
        auVar176._24_4_ = uVar178;
        auVar176._28_4_ = uVar178;
        uVar150 = vcmpps_avx512vl(auVar176,local_5a0,2);
        uVar142 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar34._4_4_ = uVar142;
        auVar34._0_4_ = uVar142;
        auVar34._8_4_ = uVar142;
        auVar34._12_4_ = uVar142;
        auVar34._16_4_ = uVar142;
        auVar34._20_4_ = uVar142;
        auVar34._24_4_ = uVar142;
        auVar34._28_4_ = uVar142;
        uVar30 = vcmpps_avx512vl(local_5a0,auVar34,2);
        bVar73 = (byte)uVar150 & (byte)uVar30 & bVar73;
        auVar199 = ZEXT3264(local_7a0);
        auVar200 = ZEXT3264(local_7c0);
        auVar202 = ZEXT3264(local_7e0);
        if (bVar73 != 0) {
          uVar150 = vcmpps_avx512vl(auVar110,auVar102,4);
          bVar73 = bVar73 & (byte)uVar150;
          if (bVar73 != 0) {
            fVar173 = auVar99._0_4_ * fVar177;
            fVar175 = auVar99._4_4_ * fVar180;
            auVar43._4_4_ = fVar175;
            auVar43._0_4_ = fVar173;
            fVar74 = auVar99._8_4_ * fVar149;
            auVar43._8_4_ = fVar74;
            fVar75 = auVar99._12_4_ * fVar174;
            auVar43._12_4_ = fVar75;
            fVar134 = auVar99._16_4_ * 0.0;
            auVar43._16_4_ = fVar134;
            fVar135 = auVar99._20_4_ * 0.0;
            auVar43._20_4_ = fVar135;
            fVar136 = auVar99._24_4_ * 0.0;
            auVar43._24_4_ = fVar136;
            auVar43._28_4_ = auVar110._28_4_;
            auVar111 = vsubps_avx512vl(auVar109,auVar43);
            local_5e0._0_4_ =
                 (float)((uint)(bVar63 & 1) * (int)fVar173 |
                        (uint)!(bool)(bVar63 & 1) * auVar111._0_4_);
            bVar69 = (bool)((byte)(uVar64 >> 1) & 1);
            local_5e0._4_4_ = (float)((uint)bVar69 * (int)fVar175 | (uint)!bVar69 * auVar111._4_4_);
            bVar69 = (bool)((byte)(uVar64 >> 2) & 1);
            local_5e0._8_4_ = (float)((uint)bVar69 * (int)fVar74 | (uint)!bVar69 * auVar111._8_4_);
            bVar69 = (bool)((byte)(uVar64 >> 3) & 1);
            local_5e0._12_4_ = (float)((uint)bVar69 * (int)fVar75 | (uint)!bVar69 * auVar111._12_4_)
            ;
            bVar69 = (bool)((byte)(uVar64 >> 4) & 1);
            local_5e0._16_4_ =
                 (float)((uint)bVar69 * (int)fVar134 | (uint)!bVar69 * auVar111._16_4_);
            bVar69 = (bool)((byte)(uVar64 >> 5) & 1);
            local_5e0._20_4_ =
                 (float)((uint)bVar69 * (int)fVar135 | (uint)!bVar69 * auVar111._20_4_);
            bVar69 = (bool)((byte)(uVar64 >> 6) & 1);
            local_5e0._24_4_ =
                 (float)((uint)bVar69 * (int)fVar136 | (uint)!bVar69 * auVar111._24_4_);
            bVar69 = SUB81(uVar64 >> 7,0);
            local_5e0._28_4_ =
                 (float)((uint)bVar69 * auVar110._28_4_ | (uint)!bVar69 * auVar111._28_4_);
            auVar110 = vsubps_avx(ZEXT1632(auVar84),auVar103);
            auVar94 = vfmadd213ps_fma(auVar110,local_5e0,auVar103);
            uVar142 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
            auVar103._4_4_ = uVar142;
            auVar103._0_4_ = uVar142;
            auVar103._8_4_ = uVar142;
            auVar103._12_4_ = uVar142;
            auVar103._16_4_ = uVar142;
            auVar103._20_4_ = uVar142;
            auVar103._24_4_ = uVar142;
            auVar103._28_4_ = uVar142;
            auVar110 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar94._12_4_ + auVar94._12_4_,
                                                          CONCAT48(auVar94._8_4_ + auVar94._8_4_,
                                                                   CONCAT44(auVar94._4_4_ +
                                                                            auVar94._4_4_,
                                                                            auVar94._0_4_ +
                                                                            auVar94._0_4_)))),
                                       auVar103);
            uVar150 = vcmpps_avx512vl(local_5a0,auVar110,6);
            if (((byte)uVar150 & bVar73) != 0) {
              auVar160._0_4_ = auVar100._0_4_ * fVar177;
              auVar160._4_4_ = auVar100._4_4_ * fVar180;
              auVar160._8_4_ = auVar100._8_4_ * fVar149;
              auVar160._12_4_ = auVar100._12_4_ * fVar174;
              auVar160._16_4_ = auVar100._16_4_ * 0.0;
              auVar160._20_4_ = auVar100._20_4_ * 0.0;
              auVar160._24_4_ = auVar100._24_4_ * 0.0;
              auVar160._28_4_ = 0;
              auVar110 = vsubps_avx512vl(auVar109,auVar160);
              auVar120._0_4_ =
                   (uint)(bVar63 & 1) * (int)auVar160._0_4_ |
                   (uint)!(bool)(bVar63 & 1) * auVar110._0_4_;
              bVar69 = (bool)((byte)(uVar64 >> 1) & 1);
              auVar120._4_4_ = (uint)bVar69 * (int)auVar160._4_4_ | (uint)!bVar69 * auVar110._4_4_;
              bVar69 = (bool)((byte)(uVar64 >> 2) & 1);
              auVar120._8_4_ = (uint)bVar69 * (int)auVar160._8_4_ | (uint)!bVar69 * auVar110._8_4_;
              bVar69 = (bool)((byte)(uVar64 >> 3) & 1);
              auVar120._12_4_ =
                   (uint)bVar69 * (int)auVar160._12_4_ | (uint)!bVar69 * auVar110._12_4_;
              bVar69 = (bool)((byte)(uVar64 >> 4) & 1);
              auVar120._16_4_ =
                   (uint)bVar69 * (int)auVar160._16_4_ | (uint)!bVar69 * auVar110._16_4_;
              bVar69 = (bool)((byte)(uVar64 >> 5) & 1);
              auVar120._20_4_ =
                   (uint)bVar69 * (int)auVar160._20_4_ | (uint)!bVar69 * auVar110._20_4_;
              bVar69 = (bool)((byte)(uVar64 >> 6) & 1);
              auVar120._24_4_ =
                   (uint)bVar69 * (int)auVar160._24_4_ | (uint)!bVar69 * auVar110._24_4_;
              auVar120._28_4_ = (uint)!SUB81(uVar64 >> 7,0) * auVar110._28_4_;
              auVar35._8_4_ = 0x40000000;
              auVar35._0_8_ = 0x4000000040000000;
              auVar35._12_4_ = 0x40000000;
              auVar35._16_4_ = 0x40000000;
              auVar35._20_4_ = 0x40000000;
              auVar35._24_4_ = 0x40000000;
              auVar35._28_4_ = 0x40000000;
              local_5c0 = vfmsub132ps_avx512vl(auVar120,auVar109,auVar35);
              local_580 = 0;
              local_570 = local_7f0._0_8_;
              uStack_568 = local_7f0._8_8_;
              local_560 = local_800._0_8_;
              uStack_558 = local_800._8_8_;
              local_550 = local_810._0_8_;
              uStack_548 = local_810._8_8_;
              if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (bVar69 = true, pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0))
                goto LAB_018ef81d;
                fVar159 = 1.0 / fVar159;
                local_520[0] = fVar159 * (local_5e0._0_4_ + 0.0);
                local_520[1] = fVar159 * (local_5e0._4_4_ + 1.0);
                local_520[2] = fVar159 * (local_5e0._8_4_ + 2.0);
                local_520[3] = fVar159 * (local_5e0._12_4_ + 3.0);
                fStack_510 = fVar159 * (local_5e0._16_4_ + 4.0);
                fStack_50c = fVar159 * (local_5e0._20_4_ + 5.0);
                fStack_508 = fVar159 * (local_5e0._24_4_ + 6.0);
                fStack_504 = local_5e0._28_4_ + 7.0;
                local_500 = local_5c0;
                local_4e0 = local_5a0;
                uVar64 = 0;
                uVar70 = (ulong)((byte)uVar150 & bVar73);
                for (uVar68 = uVar70; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x8000000000000000)
                {
                  uVar64 = uVar64 + 1;
                }
                auVar132 = vpbroadcastd_avx512f();
                local_4c0 = vmovdqa64_avx512f(auVar132);
                local_57c = iVar7;
                while( true ) {
                  auVar89 = auVar203._0_16_;
                  auVar94 = auVar196._0_16_;
                  if (uVar70 == 0) break;
                  uVar142 = *(undefined4 *)(ray + k * 4 + 0x200);
                  local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_520[uVar64]));
                  local_1c0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_500 + uVar64 * 4)));
                  *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_4e0 + uVar64 * 4);
                  local_890.context = context->user;
                  fVar149 = local_200._0_4_;
                  fVar159 = 1.0 - fVar149;
                  auVar31._8_4_ = 0x80000000;
                  auVar31._0_8_ = 0x8000000080000000;
                  auVar31._12_4_ = 0x80000000;
                  auVar90 = vxorps_avx512vl(ZEXT416((uint)fVar159),auVar31);
                  auVar89 = ZEXT416((uint)(fVar149 * fVar159 * 4.0));
                  auVar91 = vfnmsub213ss_fma(local_200._0_16_,local_200._0_16_,auVar89);
                  auVar89 = vfmadd213ss_fma(ZEXT416((uint)fVar159),ZEXT416((uint)fVar159),auVar89);
                  fVar159 = fVar159 * auVar90._0_4_ * 0.5;
                  fVar177 = auVar91._0_4_ * 0.5;
                  fVar180 = auVar89._0_4_ * 0.5;
                  fVar149 = fVar149 * fVar149 * 0.5;
                  auVar171._0_4_ = fVar149 * (float)local_690._0_4_;
                  auVar171._4_4_ = fVar149 * (float)local_690._4_4_;
                  auVar171._8_4_ = fVar149 * fStack_688;
                  auVar171._12_4_ = fVar149 * fStack_684;
                  auVar144._4_4_ = fVar180;
                  auVar144._0_4_ = fVar180;
                  auVar144._8_4_ = fVar180;
                  auVar144._12_4_ = fVar180;
                  auVar89 = vfmadd132ps_fma(auVar144,auVar171,local_810);
                  auVar164._4_4_ = fVar177;
                  auVar164._0_4_ = fVar177;
                  auVar164._8_4_ = fVar177;
                  auVar164._12_4_ = fVar177;
                  auVar89 = vfmadd132ps_fma(auVar164,auVar89,local_800);
                  auVar145._4_4_ = fVar159;
                  auVar145._0_4_ = fVar159;
                  auVar145._8_4_ = fVar159;
                  auVar145._12_4_ = fVar159;
                  auVar89 = vfmadd132ps_fma(auVar145,auVar89,local_7f0);
                  auVar132 = vbroadcastss_avx512f(auVar89);
                  auVar133 = vbroadcastss_avx512f(ZEXT416(1));
                  local_280 = vpermps_avx512f(auVar133,ZEXT1664(auVar89));
                  auVar133 = vbroadcastss_avx512f(ZEXT416(2));
                  local_240 = vpermps_avx512f(auVar133,ZEXT1664(auVar89));
                  local_2c0[0] = (RTCHitN)auVar132[0];
                  local_2c0[1] = (RTCHitN)auVar132[1];
                  local_2c0[2] = (RTCHitN)auVar132[2];
                  local_2c0[3] = (RTCHitN)auVar132[3];
                  local_2c0[4] = (RTCHitN)auVar132[4];
                  local_2c0[5] = (RTCHitN)auVar132[5];
                  local_2c0[6] = (RTCHitN)auVar132[6];
                  local_2c0[7] = (RTCHitN)auVar132[7];
                  local_2c0[8] = (RTCHitN)auVar132[8];
                  local_2c0[9] = (RTCHitN)auVar132[9];
                  local_2c0[10] = (RTCHitN)auVar132[10];
                  local_2c0[0xb] = (RTCHitN)auVar132[0xb];
                  local_2c0[0xc] = (RTCHitN)auVar132[0xc];
                  local_2c0[0xd] = (RTCHitN)auVar132[0xd];
                  local_2c0[0xe] = (RTCHitN)auVar132[0xe];
                  local_2c0[0xf] = (RTCHitN)auVar132[0xf];
                  local_2c0[0x10] = (RTCHitN)auVar132[0x10];
                  local_2c0[0x11] = (RTCHitN)auVar132[0x11];
                  local_2c0[0x12] = (RTCHitN)auVar132[0x12];
                  local_2c0[0x13] = (RTCHitN)auVar132[0x13];
                  local_2c0[0x14] = (RTCHitN)auVar132[0x14];
                  local_2c0[0x15] = (RTCHitN)auVar132[0x15];
                  local_2c0[0x16] = (RTCHitN)auVar132[0x16];
                  local_2c0[0x17] = (RTCHitN)auVar132[0x17];
                  local_2c0[0x18] = (RTCHitN)auVar132[0x18];
                  local_2c0[0x19] = (RTCHitN)auVar132[0x19];
                  local_2c0[0x1a] = (RTCHitN)auVar132[0x1a];
                  local_2c0[0x1b] = (RTCHitN)auVar132[0x1b];
                  local_2c0[0x1c] = (RTCHitN)auVar132[0x1c];
                  local_2c0[0x1d] = (RTCHitN)auVar132[0x1d];
                  local_2c0[0x1e] = (RTCHitN)auVar132[0x1e];
                  local_2c0[0x1f] = (RTCHitN)auVar132[0x1f];
                  local_2c0[0x20] = (RTCHitN)auVar132[0x20];
                  local_2c0[0x21] = (RTCHitN)auVar132[0x21];
                  local_2c0[0x22] = (RTCHitN)auVar132[0x22];
                  local_2c0[0x23] = (RTCHitN)auVar132[0x23];
                  local_2c0[0x24] = (RTCHitN)auVar132[0x24];
                  local_2c0[0x25] = (RTCHitN)auVar132[0x25];
                  local_2c0[0x26] = (RTCHitN)auVar132[0x26];
                  local_2c0[0x27] = (RTCHitN)auVar132[0x27];
                  local_2c0[0x28] = (RTCHitN)auVar132[0x28];
                  local_2c0[0x29] = (RTCHitN)auVar132[0x29];
                  local_2c0[0x2a] = (RTCHitN)auVar132[0x2a];
                  local_2c0[0x2b] = (RTCHitN)auVar132[0x2b];
                  local_2c0[0x2c] = (RTCHitN)auVar132[0x2c];
                  local_2c0[0x2d] = (RTCHitN)auVar132[0x2d];
                  local_2c0[0x2e] = (RTCHitN)auVar132[0x2e];
                  local_2c0[0x2f] = (RTCHitN)auVar132[0x2f];
                  local_2c0[0x30] = (RTCHitN)auVar132[0x30];
                  local_2c0[0x31] = (RTCHitN)auVar132[0x31];
                  local_2c0[0x32] = (RTCHitN)auVar132[0x32];
                  local_2c0[0x33] = (RTCHitN)auVar132[0x33];
                  local_2c0[0x34] = (RTCHitN)auVar132[0x34];
                  local_2c0[0x35] = (RTCHitN)auVar132[0x35];
                  local_2c0[0x36] = (RTCHitN)auVar132[0x36];
                  local_2c0[0x37] = (RTCHitN)auVar132[0x37];
                  local_2c0[0x38] = (RTCHitN)auVar132[0x38];
                  local_2c0[0x39] = (RTCHitN)auVar132[0x39];
                  local_2c0[0x3a] = (RTCHitN)auVar132[0x3a];
                  local_2c0[0x3b] = (RTCHitN)auVar132[0x3b];
                  local_2c0[0x3c] = (RTCHitN)auVar132[0x3c];
                  local_2c0[0x3d] = (RTCHitN)auVar132[0x3d];
                  local_2c0[0x3e] = (RTCHitN)auVar132[0x3e];
                  local_2c0[0x3f] = (RTCHitN)auVar132[0x3f];
                  local_180 = local_300._0_8_;
                  uStack_178 = local_300._8_8_;
                  uStack_170 = local_300._16_8_;
                  uStack_168 = local_300._24_8_;
                  uStack_160 = local_300._32_8_;
                  uStack_158 = local_300._40_8_;
                  uStack_150 = local_300._48_8_;
                  uStack_148 = local_300._56_8_;
                  auVar132 = vmovdqa64_avx512f(local_4c0);
                  local_140 = vmovdqa64_avx512f(auVar132);
                  vpcmpeqd_avx2(auVar132._0_32_,auVar132._0_32_);
                  local_100 = vbroadcastss_avx512f(ZEXT416((local_890.context)->instID[0]));
                  local_c0 = vbroadcastss_avx512f(ZEXT416((local_890.context)->instPrimID[0]));
                  auVar132 = vmovdqa64_avx512f(local_340);
                  local_640 = vmovdqa64_avx512f(auVar132);
                  local_890.valid = (int *)local_640;
                  local_890.geometryUserPtr = pGVar8->userPtr;
                  local_890.hit = local_2c0;
                  local_890.N = 0x10;
                  local_660 = (uint)uVar70;
                  uStack_65c = (uint)(uVar70 >> 0x20);
                  local_680 = (undefined1  [8])uVar64;
                  auVar71 = (undefined1  [8])uVar64;
                  local_890.ray = (RTCRayN *)ray;
                  if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar8->occlusionFilterN)(&local_890);
                    uVar70 = CONCAT44(uStack_65c,local_660);
                    auVar203 = ZEXT1664(local_6c0._0_16_);
                    auVar202 = ZEXT3264(local_7e0);
                    auVar200 = ZEXT3264(local_7c0);
                    auVar201 = ZEXT3264(local_720);
                    auVar199 = ZEXT3264(local_7a0);
                    auVar148 = ZEXT3264(local_860);
                    auVar194 = ZEXT3264(local_840);
                    auVar198 = ZEXT3264(local_6e0);
                    auVar197 = ZEXT3264(local_700);
                    auVar89 = vxorps_avx512vl(auVar94,auVar94);
                    auVar196 = ZEXT1664(auVar89);
                    auVar110 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar195 = ZEXT3264(auVar110);
                    auVar132 = vmovdqa64_avx512f(local_640);
                    auVar71 = local_680;
                    uVar178 = local_740._0_4_;
                  }
                  auVar89 = auVar196._0_16_;
                  uVar150 = vptestmd_avx512f(auVar132,auVar132);
                  if ((short)uVar150 != 0) {
                    p_Var11 = context->args->filter;
                    if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var11)(&local_890);
                      uVar70 = CONCAT44(uStack_65c,local_660);
                      auVar203 = ZEXT1664(local_6c0._0_16_);
                      auVar202 = ZEXT3264(local_7e0);
                      auVar200 = ZEXT3264(local_7c0);
                      auVar201 = ZEXT3264(local_720);
                      auVar199 = ZEXT3264(local_7a0);
                      auVar148 = ZEXT3264(local_860);
                      auVar194 = ZEXT3264(local_840);
                      auVar198 = ZEXT3264(local_6e0);
                      auVar197 = ZEXT3264(local_700);
                      auVar89 = vxorps_avx512vl(auVar89,auVar89);
                      auVar196 = ZEXT1664(auVar89);
                      auVar110 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar195 = ZEXT3264(auVar110);
                      auVar132 = vmovdqa64_avx512f(local_640);
                      auVar71 = local_680;
                      uVar178 = local_740._0_4_;
                    }
                    auVar89 = auVar203._0_16_;
                    uVar64 = vptestmd_avx512f(auVar132,auVar132);
                    auVar132 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                    bVar69 = (bool)((byte)uVar64 & 1);
                    bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
                    bVar13 = (bool)((byte)(uVar64 >> 2) & 1);
                    bVar14 = (bool)((byte)(uVar64 >> 3) & 1);
                    bVar15 = (bool)((byte)(uVar64 >> 4) & 1);
                    bVar16 = (bool)((byte)(uVar64 >> 5) & 1);
                    bVar17 = (bool)((byte)(uVar64 >> 6) & 1);
                    bVar18 = (bool)((byte)(uVar64 >> 7) & 1);
                    bVar19 = (bool)((byte)(uVar64 >> 8) & 1);
                    bVar20 = (bool)((byte)(uVar64 >> 9) & 1);
                    bVar21 = (bool)((byte)(uVar64 >> 10) & 1);
                    bVar22 = (bool)((byte)(uVar64 >> 0xb) & 1);
                    bVar23 = (bool)((byte)(uVar64 >> 0xc) & 1);
                    bVar24 = (bool)((byte)(uVar64 >> 0xd) & 1);
                    bVar25 = (bool)((byte)(uVar64 >> 0xe) & 1);
                    bVar26 = SUB81(uVar64 >> 0xf,0);
                    *(uint *)(local_890.ray + 0x200) =
                         (uint)bVar69 * auVar132._0_4_ |
                         (uint)!bVar69 * *(int *)(local_890.ray + 0x200);
                    *(uint *)(local_890.ray + 0x204) =
                         (uint)bVar12 * auVar132._4_4_ |
                         (uint)!bVar12 * *(int *)(local_890.ray + 0x204);
                    *(uint *)(local_890.ray + 0x208) =
                         (uint)bVar13 * auVar132._8_4_ |
                         (uint)!bVar13 * *(int *)(local_890.ray + 0x208);
                    *(uint *)(local_890.ray + 0x20c) =
                         (uint)bVar14 * auVar132._12_4_ |
                         (uint)!bVar14 * *(int *)(local_890.ray + 0x20c);
                    *(uint *)(local_890.ray + 0x210) =
                         (uint)bVar15 * auVar132._16_4_ |
                         (uint)!bVar15 * *(int *)(local_890.ray + 0x210);
                    *(uint *)(local_890.ray + 0x214) =
                         (uint)bVar16 * auVar132._20_4_ |
                         (uint)!bVar16 * *(int *)(local_890.ray + 0x214);
                    *(uint *)(local_890.ray + 0x218) =
                         (uint)bVar17 * auVar132._24_4_ |
                         (uint)!bVar17 * *(int *)(local_890.ray + 0x218);
                    *(uint *)(local_890.ray + 0x21c) =
                         (uint)bVar18 * auVar132._28_4_ |
                         (uint)!bVar18 * *(int *)(local_890.ray + 0x21c);
                    *(uint *)(local_890.ray + 0x220) =
                         (uint)bVar19 * auVar132._32_4_ |
                         (uint)!bVar19 * *(int *)(local_890.ray + 0x220);
                    *(uint *)(local_890.ray + 0x224) =
                         (uint)bVar20 * auVar132._36_4_ |
                         (uint)!bVar20 * *(int *)(local_890.ray + 0x224);
                    *(uint *)(local_890.ray + 0x228) =
                         (uint)bVar21 * auVar132._40_4_ |
                         (uint)!bVar21 * *(int *)(local_890.ray + 0x228);
                    *(uint *)(local_890.ray + 0x22c) =
                         (uint)bVar22 * auVar132._44_4_ |
                         (uint)!bVar22 * *(int *)(local_890.ray + 0x22c);
                    *(uint *)(local_890.ray + 0x230) =
                         (uint)bVar23 * auVar132._48_4_ |
                         (uint)!bVar23 * *(int *)(local_890.ray + 0x230);
                    *(uint *)(local_890.ray + 0x234) =
                         (uint)bVar24 * auVar132._52_4_ |
                         (uint)!bVar24 * *(int *)(local_890.ray + 0x234);
                    *(uint *)(local_890.ray + 0x238) =
                         (uint)bVar25 * auVar132._56_4_ |
                         (uint)!bVar25 * *(int *)(local_890.ray + 0x238);
                    *(uint *)(local_890.ray + 0x23c) =
                         (uint)bVar26 * auVar132._60_4_ |
                         (uint)!bVar26 * *(int *)(local_890.ray + 0x23c);
                    if ((short)uVar64 != 0) {
                      bVar69 = true;
                      goto LAB_018ef81d;
                    }
                  }
                  *(undefined4 *)(ray + k * 4 + 0x200) = uVar142;
                  uVar64 = 0;
                  uVar70 = uVar70 ^ 1L << ((ulong)auVar71 & 0x3f);
                  for (uVar68 = uVar70; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x8000000000000000
                      ) {
                    uVar64 = uVar64 + 1;
                  }
                }
              }
            }
          }
        }
        bVar69 = false;
      }
    }
LAB_018ef81d:
    if (8 < iVar7) {
      local_6c0 = vpbroadcastd_avx512vl();
      local_740 = vbroadcastss_avx512vl(auVar89);
      local_680._0_4_ = 1.0 / (float)local_480._0_4_;
      local_680._4_4_ = local_680._0_4_;
      fStack_678 = (float)local_680._0_4_;
      fStack_674 = (float)local_680._0_4_;
      fStack_670 = (float)local_680._0_4_;
      fStack_66c = (float)local_680._0_4_;
      fStack_668 = (float)local_680._0_4_;
      register0x0000121c = local_680._0_4_;
      auVar203 = vpbroadcastd_avx512f();
      local_480 = vmovdqa64_avx512f(auVar203);
      local_660 = uVar178;
      uStack_65c = uVar178;
      uStack_658 = uVar178;
      uStack_654 = uVar178;
      uStack_650 = uVar178;
      uStack_64c = uVar178;
      uStack_648 = uVar178;
      uStack_644 = uVar178;
      for (lVar66 = 8; lVar66 < iVar7; lVar66 = lVar66 + 8) {
        auVar110 = vpbroadcastd_avx512vl();
        auVar96 = vpor_avx2(auVar110,_DAT_01fb4ba0);
        uVar30 = vpcmpd_avx512vl(auVar96,local_6c0,1);
        auVar110 = *(undefined1 (*) [32])(bspline_basis0 + lVar66 * 4 + lVar65);
        auVar111 = *(undefined1 (*) [32])(lVar65 + 0x21fffac + lVar66 * 4);
        auVar109 = *(undefined1 (*) [32])(lVar65 + 0x2200430 + lVar66 * 4);
        auVar108 = *(undefined1 (*) [32])(lVar65 + 0x22008b4 + lVar66 * 4);
        local_7c0 = auVar200._0_32_;
        auVar97 = vmulps_avx512vl(local_7c0,auVar108);
        local_7e0 = auVar202._0_32_;
        auVar107 = vmulps_avx512vl(local_7e0,auVar108);
        auVar44._4_4_ = auVar108._4_4_ * (float)local_3c0._4_4_;
        auVar44._0_4_ = auVar108._0_4_ * (float)local_3c0._0_4_;
        auVar44._8_4_ = auVar108._8_4_ * fStack_3b8;
        auVar44._12_4_ = auVar108._12_4_ * fStack_3b4;
        auVar44._16_4_ = auVar108._16_4_ * fStack_3b0;
        auVar44._20_4_ = auVar108._20_4_ * fStack_3ac;
        auVar44._24_4_ = auVar108._24_4_ * fStack_3a8;
        auVar44._28_4_ = auVar96._28_4_;
        local_7a0 = auVar199._0_32_;
        auVar96 = vfmadd231ps_avx512vl(auVar97,auVar109,local_7a0);
        auVar115 = auVar201._0_32_;
        auVar97 = vfmadd231ps_avx512vl(auVar107,auVar109,auVar115);
        auVar107 = vfmadd231ps_avx512vl(auVar44,auVar109,local_3a0);
        auVar113 = auVar194._0_32_;
        auVar96 = vfmadd231ps_avx512vl(auVar96,auVar111,auVar113);
        auVar112 = auVar148._0_32_;
        auVar97 = vfmadd231ps_avx512vl(auVar97,auVar111,auVar112);
        auVar89 = vfmadd231ps_fma(auVar107,auVar111,local_380);
        auVar114 = auVar197._0_32_;
        auVar100 = vfmadd231ps_avx512vl(auVar96,auVar110,auVar114);
        local_6e0 = auVar198._0_32_;
        auVar101 = vfmadd231ps_avx512vl(auVar97,auVar110,local_6e0);
        auVar96 = *(undefined1 (*) [32])(bspline_basis1 + lVar66 * 4 + lVar65);
        auVar97 = *(undefined1 (*) [32])(lVar65 + 0x22023cc + lVar66 * 4);
        auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar110,local_360);
        auVar107 = *(undefined1 (*) [32])(lVar65 + 0x2202850 + lVar66 * 4);
        auVar106 = *(undefined1 (*) [32])(lVar65 + 0x2202cd4 + lVar66 * 4);
        auVar98 = vmulps_avx512vl(local_7c0,auVar106);
        auVar99 = vmulps_avx512vl(local_7e0,auVar106);
        auVar45._4_4_ = auVar106._4_4_ * (float)local_3c0._4_4_;
        auVar45._0_4_ = auVar106._0_4_ * (float)local_3c0._0_4_;
        auVar45._8_4_ = auVar106._8_4_ * fStack_3b8;
        auVar45._12_4_ = auVar106._12_4_ * fStack_3b4;
        auVar45._16_4_ = auVar106._16_4_ * fStack_3b0;
        auVar45._20_4_ = auVar106._20_4_ * fStack_3ac;
        auVar45._24_4_ = auVar106._24_4_ * fStack_3a8;
        auVar45._28_4_ = uStack_3a4;
        auVar98 = vfmadd231ps_avx512vl(auVar98,auVar107,local_7a0);
        auVar99 = vfmadd231ps_avx512vl(auVar99,auVar107,auVar115);
        auVar102 = vfmadd231ps_avx512vl(auVar45,auVar107,local_3a0);
        auVar98 = vfmadd231ps_avx512vl(auVar98,auVar97,auVar113);
        auVar99 = vfmadd231ps_avx512vl(auVar99,auVar97,auVar112);
        auVar94 = vfmadd231ps_fma(auVar102,auVar97,local_380);
        auVar102 = vfmadd231ps_avx512vl(auVar98,auVar96,auVar114);
        auVar103 = vfmadd231ps_avx512vl(auVar99,auVar96,local_6e0);
        auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar96,local_360);
        auVar104 = vmaxps_avx512vl(ZEXT1632(auVar89),ZEXT1632(auVar94));
        auVar98 = vsubps_avx(auVar102,auVar100);
        auVar99 = vsubps_avx(auVar103,auVar101);
        auVar105 = vmulps_avx512vl(auVar101,auVar98);
        auVar121 = vmulps_avx512vl(auVar100,auVar99);
        auVar105 = vsubps_avx512vl(auVar105,auVar121);
        auVar121 = vmulps_avx512vl(auVar99,auVar99);
        auVar121 = vfmadd231ps_avx512vl(auVar121,auVar98,auVar98);
        auVar104 = vmulps_avx512vl(auVar104,auVar104);
        auVar104 = vmulps_avx512vl(auVar104,auVar121);
        auVar105 = vmulps_avx512vl(auVar105,auVar105);
        uVar150 = vcmpps_avx512vl(auVar105,auVar104,2);
        bVar73 = (byte)uVar30 & (byte)uVar150;
        if (bVar73 == 0) {
          auVar194 = ZEXT3264(auVar113);
          auVar148 = ZEXT3264(auVar112);
        }
        else {
          auVar106 = vmulps_avx512vl(local_780,auVar106);
          auVar107 = vfmadd213ps_avx512vl(auVar107,local_420,auVar106);
          auVar97 = vfmadd213ps_avx512vl(auVar97,local_400,auVar107);
          auVar96 = vfmadd213ps_avx512vl(auVar96,local_3e0,auVar97);
          auVar108 = vmulps_avx512vl(local_780,auVar108);
          auVar109 = vfmadd213ps_avx512vl(auVar109,local_420,auVar108);
          auVar111 = vfmadd213ps_avx512vl(auVar111,local_400,auVar109);
          auVar97 = vfmadd213ps_avx512vl(auVar110,local_3e0,auVar111);
          auVar110 = *(undefined1 (*) [32])(lVar65 + 0x2200d38 + lVar66 * 4);
          auVar111 = *(undefined1 (*) [32])(lVar65 + 0x22011bc + lVar66 * 4);
          auVar109 = *(undefined1 (*) [32])(lVar65 + 0x2201640 + lVar66 * 4);
          auVar108 = *(undefined1 (*) [32])(lVar65 + 0x2201ac4 + lVar66 * 4);
          auVar107 = vmulps_avx512vl(local_7c0,auVar108);
          auVar106 = vmulps_avx512vl(local_7e0,auVar108);
          auVar108 = vmulps_avx512vl(local_780,auVar108);
          auVar107 = vfmadd231ps_avx512vl(auVar107,auVar109,local_7a0);
          auVar106 = vfmadd231ps_avx512vl(auVar106,auVar109,auVar115);
          auVar109 = vfmadd231ps_avx512vl(auVar108,local_420,auVar109);
          auVar108 = vfmadd231ps_avx512vl(auVar107,auVar111,auVar113);
          auVar107 = vfmadd231ps_avx512vl(auVar106,auVar111,auVar112);
          auVar111 = vfmadd231ps_avx512vl(auVar109,local_400,auVar111);
          auVar108 = vfmadd231ps_avx512vl(auVar108,auVar110,auVar114);
          auVar107 = vfmadd231ps_avx512vl(auVar107,auVar110,local_6e0);
          auVar106 = vfmadd231ps_avx512vl(auVar111,local_3e0,auVar110);
          auVar110 = *(undefined1 (*) [32])(lVar65 + 0x2203158 + lVar66 * 4);
          auVar111 = *(undefined1 (*) [32])(lVar65 + 0x2203a60 + lVar66 * 4);
          auVar109 = *(undefined1 (*) [32])(lVar65 + 0x2203ee4 + lVar66 * 4);
          auVar104 = vmulps_avx512vl(local_7c0,auVar109);
          auVar105 = vmulps_avx512vl(local_7e0,auVar109);
          auVar109 = vmulps_avx512vl(local_780,auVar109);
          auVar104 = vfmadd231ps_avx512vl(auVar104,auVar111,local_7a0);
          auVar105 = vfmadd231ps_avx512vl(auVar105,auVar111,auVar115);
          auVar109 = vfmadd231ps_avx512vl(auVar109,local_420,auVar111);
          auVar111 = *(undefined1 (*) [32])(lVar65 + 0x22035dc + lVar66 * 4);
          auVar104 = vfmadd231ps_avx512vl(auVar104,auVar111,auVar113);
          auVar105 = vfmadd231ps_avx512vl(auVar105,auVar111,auVar112);
          auVar111 = vfmadd231ps_avx512vl(auVar109,local_400,auVar111);
          auVar109 = vfmadd231ps_avx512vl(auVar104,auVar110,auVar114);
          auVar104 = vfmadd231ps_avx512vl(auVar105,auVar110,local_6e0);
          auVar111 = vfmadd231ps_avx512vl(auVar111,local_3e0,auVar110);
          auVar105 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar108,auVar105);
          vandps_avx512vl(auVar107,auVar105);
          auVar110 = vmaxps_avx(auVar105,auVar105);
          vandps_avx512vl(auVar106,auVar105);
          auVar110 = vmaxps_avx(auVar110,auVar105);
          uVar64 = vcmpps_avx512vl(auVar110,local_740,1);
          bVar12 = (bool)((byte)uVar64 & 1);
          auVar122._0_4_ = (float)((uint)bVar12 * auVar98._0_4_ | (uint)!bVar12 * auVar108._0_4_);
          bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
          auVar122._4_4_ = (float)((uint)bVar12 * auVar98._4_4_ | (uint)!bVar12 * auVar108._4_4_);
          bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
          auVar122._8_4_ = (float)((uint)bVar12 * auVar98._8_4_ | (uint)!bVar12 * auVar108._8_4_);
          bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
          auVar122._12_4_ = (float)((uint)bVar12 * auVar98._12_4_ | (uint)!bVar12 * auVar108._12_4_)
          ;
          bVar12 = (bool)((byte)(uVar64 >> 4) & 1);
          auVar122._16_4_ = (float)((uint)bVar12 * auVar98._16_4_ | (uint)!bVar12 * auVar108._16_4_)
          ;
          bVar12 = (bool)((byte)(uVar64 >> 5) & 1);
          auVar122._20_4_ = (float)((uint)bVar12 * auVar98._20_4_ | (uint)!bVar12 * auVar108._20_4_)
          ;
          bVar12 = (bool)((byte)(uVar64 >> 6) & 1);
          auVar122._24_4_ = (float)((uint)bVar12 * auVar98._24_4_ | (uint)!bVar12 * auVar108._24_4_)
          ;
          bVar12 = SUB81(uVar64 >> 7,0);
          auVar122._28_4_ = (uint)bVar12 * auVar98._28_4_ | (uint)!bVar12 * auVar108._28_4_;
          bVar12 = (bool)((byte)uVar64 & 1);
          auVar123._0_4_ = (float)((uint)bVar12 * auVar99._0_4_ | (uint)!bVar12 * auVar107._0_4_);
          bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
          auVar123._4_4_ = (float)((uint)bVar12 * auVar99._4_4_ | (uint)!bVar12 * auVar107._4_4_);
          bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
          auVar123._8_4_ = (float)((uint)bVar12 * auVar99._8_4_ | (uint)!bVar12 * auVar107._8_4_);
          bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
          auVar123._12_4_ = (float)((uint)bVar12 * auVar99._12_4_ | (uint)!bVar12 * auVar107._12_4_)
          ;
          bVar12 = (bool)((byte)(uVar64 >> 4) & 1);
          auVar123._16_4_ = (float)((uint)bVar12 * auVar99._16_4_ | (uint)!bVar12 * auVar107._16_4_)
          ;
          bVar12 = (bool)((byte)(uVar64 >> 5) & 1);
          auVar123._20_4_ = (float)((uint)bVar12 * auVar99._20_4_ | (uint)!bVar12 * auVar107._20_4_)
          ;
          bVar12 = (bool)((byte)(uVar64 >> 6) & 1);
          auVar123._24_4_ = (float)((uint)bVar12 * auVar99._24_4_ | (uint)!bVar12 * auVar107._24_4_)
          ;
          bVar12 = SUB81(uVar64 >> 7,0);
          auVar123._28_4_ = (uint)bVar12 * auVar99._28_4_ | (uint)!bVar12 * auVar107._28_4_;
          vandps_avx512vl(auVar109,auVar105);
          vandps_avx512vl(auVar104,auVar105);
          auVar110 = vmaxps_avx(auVar123,auVar123);
          vandps_avx512vl(auVar111,auVar105);
          auVar110 = vmaxps_avx(auVar110,auVar123);
          uVar64 = vcmpps_avx512vl(auVar110,local_740,1);
          bVar12 = (bool)((byte)uVar64 & 1);
          auVar124._0_4_ = (uint)bVar12 * auVar98._0_4_ | (uint)!bVar12 * auVar109._0_4_;
          bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
          auVar124._4_4_ = (uint)bVar12 * auVar98._4_4_ | (uint)!bVar12 * auVar109._4_4_;
          bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
          auVar124._8_4_ = (uint)bVar12 * auVar98._8_4_ | (uint)!bVar12 * auVar109._8_4_;
          bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
          auVar124._12_4_ = (uint)bVar12 * auVar98._12_4_ | (uint)!bVar12 * auVar109._12_4_;
          bVar12 = (bool)((byte)(uVar64 >> 4) & 1);
          auVar124._16_4_ = (uint)bVar12 * auVar98._16_4_ | (uint)!bVar12 * auVar109._16_4_;
          bVar12 = (bool)((byte)(uVar64 >> 5) & 1);
          auVar124._20_4_ = (uint)bVar12 * auVar98._20_4_ | (uint)!bVar12 * auVar109._20_4_;
          bVar12 = (bool)((byte)(uVar64 >> 6) & 1);
          auVar124._24_4_ = (uint)bVar12 * auVar98._24_4_ | (uint)!bVar12 * auVar109._24_4_;
          bVar12 = SUB81(uVar64 >> 7,0);
          auVar124._28_4_ = (uint)bVar12 * auVar98._28_4_ | (uint)!bVar12 * auVar109._28_4_;
          bVar12 = (bool)((byte)uVar64 & 1);
          auVar125._0_4_ = (float)((uint)bVar12 * auVar99._0_4_ | (uint)!bVar12 * auVar104._0_4_);
          bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
          auVar125._4_4_ = (float)((uint)bVar12 * auVar99._4_4_ | (uint)!bVar12 * auVar104._4_4_);
          bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
          auVar125._8_4_ = (float)((uint)bVar12 * auVar99._8_4_ | (uint)!bVar12 * auVar104._8_4_);
          bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
          auVar125._12_4_ = (float)((uint)bVar12 * auVar99._12_4_ | (uint)!bVar12 * auVar104._12_4_)
          ;
          bVar12 = (bool)((byte)(uVar64 >> 4) & 1);
          auVar125._16_4_ = (float)((uint)bVar12 * auVar99._16_4_ | (uint)!bVar12 * auVar104._16_4_)
          ;
          bVar12 = (bool)((byte)(uVar64 >> 5) & 1);
          auVar125._20_4_ = (float)((uint)bVar12 * auVar99._20_4_ | (uint)!bVar12 * auVar104._20_4_)
          ;
          bVar12 = (bool)((byte)(uVar64 >> 6) & 1);
          auVar125._24_4_ = (float)((uint)bVar12 * auVar99._24_4_ | (uint)!bVar12 * auVar104._24_4_)
          ;
          bVar12 = SUB81(uVar64 >> 7,0);
          auVar125._28_4_ = (uint)bVar12 * auVar99._28_4_ | (uint)!bVar12 * auVar104._28_4_;
          auVar182._8_4_ = 0x80000000;
          auVar182._0_8_ = 0x8000000080000000;
          auVar182._12_4_ = 0x80000000;
          auVar182._16_4_ = 0x80000000;
          auVar182._20_4_ = 0x80000000;
          auVar182._24_4_ = 0x80000000;
          auVar182._28_4_ = 0x80000000;
          auVar110 = vxorps_avx512vl(auVar124,auVar182);
          auVar104 = auVar196._0_32_;
          auVar111 = vfmadd213ps_avx512vl(auVar122,auVar122,auVar104);
          auVar91 = vfmadd231ps_fma(auVar111,auVar123,auVar123);
          auVar111 = vrsqrt14ps_avx512vl(ZEXT1632(auVar91));
          auVar193._8_4_ = 0xbf000000;
          auVar193._0_8_ = 0xbf000000bf000000;
          auVar193._12_4_ = 0xbf000000;
          auVar193._16_4_ = 0xbf000000;
          auVar193._20_4_ = 0xbf000000;
          auVar193._24_4_ = 0xbf000000;
          auVar193._28_4_ = 0xbf000000;
          fVar159 = auVar111._0_4_;
          fVar177 = auVar111._4_4_;
          fVar180 = auVar111._8_4_;
          fVar149 = auVar111._12_4_;
          fVar174 = auVar111._16_4_;
          fVar173 = auVar111._20_4_;
          fVar175 = auVar111._24_4_;
          auVar46._4_4_ = fVar177 * fVar177 * fVar177 * auVar91._4_4_ * -0.5;
          auVar46._0_4_ = fVar159 * fVar159 * fVar159 * auVar91._0_4_ * -0.5;
          auVar46._8_4_ = fVar180 * fVar180 * fVar180 * auVar91._8_4_ * -0.5;
          auVar46._12_4_ = fVar149 * fVar149 * fVar149 * auVar91._12_4_ * -0.5;
          auVar46._16_4_ = fVar174 * fVar174 * fVar174 * -0.0;
          auVar46._20_4_ = fVar173 * fVar173 * fVar173 * -0.0;
          auVar46._24_4_ = fVar175 * fVar175 * fVar175 * -0.0;
          auVar46._28_4_ = auVar123._28_4_;
          auVar109 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar111 = vfmadd231ps_avx512vl(auVar46,auVar109,auVar111);
          auVar47._4_4_ = auVar123._4_4_ * auVar111._4_4_;
          auVar47._0_4_ = auVar123._0_4_ * auVar111._0_4_;
          auVar47._8_4_ = auVar123._8_4_ * auVar111._8_4_;
          auVar47._12_4_ = auVar123._12_4_ * auVar111._12_4_;
          auVar47._16_4_ = auVar123._16_4_ * auVar111._16_4_;
          auVar47._20_4_ = auVar123._20_4_ * auVar111._20_4_;
          auVar47._24_4_ = auVar123._24_4_ * auVar111._24_4_;
          auVar47._28_4_ = 0;
          auVar48._4_4_ = auVar111._4_4_ * -auVar122._4_4_;
          auVar48._0_4_ = auVar111._0_4_ * -auVar122._0_4_;
          auVar48._8_4_ = auVar111._8_4_ * -auVar122._8_4_;
          auVar48._12_4_ = auVar111._12_4_ * -auVar122._12_4_;
          auVar48._16_4_ = auVar111._16_4_ * -auVar122._16_4_;
          auVar48._20_4_ = auVar111._20_4_ * -auVar122._20_4_;
          auVar48._24_4_ = auVar111._24_4_ * -auVar122._24_4_;
          auVar48._28_4_ = auVar123._28_4_;
          auVar108 = vmulps_avx512vl(auVar111,auVar104);
          auVar111 = vfmadd213ps_avx512vl(auVar124,auVar124,auVar104);
          auVar111 = vfmadd231ps_avx512vl(auVar111,auVar125,auVar125);
          auVar107 = vrsqrt14ps_avx512vl(auVar111);
          auVar111 = vmulps_avx512vl(auVar111,auVar193);
          fVar159 = auVar107._0_4_;
          fVar177 = auVar107._4_4_;
          fVar180 = auVar107._8_4_;
          fVar149 = auVar107._12_4_;
          fVar174 = auVar107._16_4_;
          fVar173 = auVar107._20_4_;
          fVar175 = auVar107._24_4_;
          auVar49._4_4_ = fVar177 * fVar177 * fVar177 * auVar111._4_4_;
          auVar49._0_4_ = fVar159 * fVar159 * fVar159 * auVar111._0_4_;
          auVar49._8_4_ = fVar180 * fVar180 * fVar180 * auVar111._8_4_;
          auVar49._12_4_ = fVar149 * fVar149 * fVar149 * auVar111._12_4_;
          auVar49._16_4_ = fVar174 * fVar174 * fVar174 * auVar111._16_4_;
          auVar49._20_4_ = fVar173 * fVar173 * fVar173 * auVar111._20_4_;
          auVar49._24_4_ = fVar175 * fVar175 * fVar175 * auVar111._24_4_;
          auVar49._28_4_ = auVar111._28_4_;
          auVar111 = vfmadd231ps_avx512vl(auVar49,auVar109,auVar107);
          auVar50._4_4_ = auVar125._4_4_ * auVar111._4_4_;
          auVar50._0_4_ = auVar125._0_4_ * auVar111._0_4_;
          auVar50._8_4_ = auVar125._8_4_ * auVar111._8_4_;
          auVar50._12_4_ = auVar125._12_4_ * auVar111._12_4_;
          auVar50._16_4_ = auVar125._16_4_ * auVar111._16_4_;
          auVar50._20_4_ = auVar125._20_4_ * auVar111._20_4_;
          auVar50._24_4_ = auVar125._24_4_ * auVar111._24_4_;
          auVar50._28_4_ = auVar107._28_4_;
          auVar51._4_4_ = auVar111._4_4_ * auVar110._4_4_;
          auVar51._0_4_ = auVar111._0_4_ * auVar110._0_4_;
          auVar51._8_4_ = auVar111._8_4_ * auVar110._8_4_;
          auVar51._12_4_ = auVar111._12_4_ * auVar110._12_4_;
          auVar51._16_4_ = auVar111._16_4_ * auVar110._16_4_;
          auVar51._20_4_ = auVar111._20_4_ * auVar110._20_4_;
          auVar51._24_4_ = auVar111._24_4_ * auVar110._24_4_;
          auVar51._28_4_ = auVar110._28_4_;
          auVar110 = vmulps_avx512vl(auVar111,auVar104);
          auVar91 = vfmadd213ps_fma(auVar47,ZEXT1632(auVar89),auVar100);
          auVar111 = ZEXT1632(auVar89);
          auVar90 = vfmadd213ps_fma(auVar48,auVar111,auVar101);
          auVar109 = vfmadd213ps_avx512vl(auVar108,auVar111,auVar97);
          auVar107 = vfmadd213ps_avx512vl(auVar50,ZEXT1632(auVar94),auVar102);
          auVar83 = vfnmadd213ps_fma(auVar47,auVar111,auVar100);
          auVar106 = ZEXT1632(auVar94);
          auVar27 = vfmadd213ps_fma(auVar51,auVar106,auVar103);
          auVar84 = vfnmadd213ps_fma(auVar48,auVar111,auVar101);
          auVar85 = vfmadd213ps_fma(auVar110,auVar106,auVar96);
          auVar101 = ZEXT1632(auVar89);
          auVar88 = vfnmadd231ps_fma(auVar97,auVar101,auVar108);
          auVar86 = vfnmadd213ps_fma(auVar50,auVar106,auVar102);
          auVar87 = vfnmadd213ps_fma(auVar51,auVar106,auVar103);
          auVar95 = vfnmadd231ps_fma(auVar96,ZEXT1632(auVar94),auVar110);
          auVar96 = vsubps_avx512vl(auVar107,ZEXT1632(auVar83));
          auVar110 = vsubps_avx(ZEXT1632(auVar27),ZEXT1632(auVar84));
          auVar111 = vsubps_avx(ZEXT1632(auVar85),ZEXT1632(auVar88));
          auVar52._4_4_ = auVar110._4_4_ * auVar88._4_4_;
          auVar52._0_4_ = auVar110._0_4_ * auVar88._0_4_;
          auVar52._8_4_ = auVar110._8_4_ * auVar88._8_4_;
          auVar52._12_4_ = auVar110._12_4_ * auVar88._12_4_;
          auVar52._16_4_ = auVar110._16_4_ * 0.0;
          auVar52._20_4_ = auVar110._20_4_ * 0.0;
          auVar52._24_4_ = auVar110._24_4_ * 0.0;
          auVar52._28_4_ = auVar108._28_4_;
          auVar89 = vfmsub231ps_fma(auVar52,ZEXT1632(auVar84),auVar111);
          auVar53._4_4_ = auVar111._4_4_ * auVar83._4_4_;
          auVar53._0_4_ = auVar111._0_4_ * auVar83._0_4_;
          auVar53._8_4_ = auVar111._8_4_ * auVar83._8_4_;
          auVar53._12_4_ = auVar111._12_4_ * auVar83._12_4_;
          auVar53._16_4_ = auVar111._16_4_ * 0.0;
          auVar53._20_4_ = auVar111._20_4_ * 0.0;
          auVar53._24_4_ = auVar111._24_4_ * 0.0;
          auVar53._28_4_ = auVar111._28_4_;
          auVar81 = vfmsub231ps_fma(auVar53,ZEXT1632(auVar88),auVar96);
          auVar54._4_4_ = auVar84._4_4_ * auVar96._4_4_;
          auVar54._0_4_ = auVar84._0_4_ * auVar96._0_4_;
          auVar54._8_4_ = auVar84._8_4_ * auVar96._8_4_;
          auVar54._12_4_ = auVar84._12_4_ * auVar96._12_4_;
          auVar54._16_4_ = auVar96._16_4_ * 0.0;
          auVar54._20_4_ = auVar96._20_4_ * 0.0;
          auVar54._24_4_ = auVar96._24_4_ * 0.0;
          auVar54._28_4_ = auVar96._28_4_;
          auVar82 = vfmsub231ps_fma(auVar54,ZEXT1632(auVar83),auVar110);
          auVar110 = vfmadd231ps_avx512vl(ZEXT1632(auVar82),auVar104,ZEXT1632(auVar81));
          auVar110 = vfmadd231ps_avx512vl(auVar110,auVar104,ZEXT1632(auVar89));
          uVar64 = vcmpps_avx512vl(auVar110,auVar104,2);
          bVar63 = (byte)uVar64;
          fVar134 = (float)((uint)(bVar63 & 1) * auVar91._0_4_ |
                           (uint)!(bool)(bVar63 & 1) * auVar86._0_4_);
          bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
          fVar136 = (float)((uint)bVar12 * auVar91._4_4_ | (uint)!bVar12 * auVar86._4_4_);
          bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
          fVar138 = (float)((uint)bVar12 * auVar91._8_4_ | (uint)!bVar12 * auVar86._8_4_);
          bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
          fVar140 = (float)((uint)bVar12 * auVar91._12_4_ | (uint)!bVar12 * auVar86._12_4_);
          auVar106 = ZEXT1632(CONCAT412(fVar140,CONCAT48(fVar138,CONCAT44(fVar136,fVar134))));
          fVar135 = (float)((uint)(bVar63 & 1) * auVar90._0_4_ |
                           (uint)!(bool)(bVar63 & 1) * auVar87._0_4_);
          bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
          fVar137 = (float)((uint)bVar12 * auVar90._4_4_ | (uint)!bVar12 * auVar87._4_4_);
          bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
          fVar139 = (float)((uint)bVar12 * auVar90._8_4_ | (uint)!bVar12 * auVar87._8_4_);
          bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
          fVar141 = (float)((uint)bVar12 * auVar90._12_4_ | (uint)!bVar12 * auVar87._12_4_);
          auVar98 = ZEXT1632(CONCAT412(fVar141,CONCAT48(fVar139,CONCAT44(fVar137,fVar135))));
          auVar126._0_4_ =
               (float)((uint)(bVar63 & 1) * auVar109._0_4_ |
                      (uint)!(bool)(bVar63 & 1) * auVar95._0_4_);
          bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
          auVar126._4_4_ = (float)((uint)bVar12 * auVar109._4_4_ | (uint)!bVar12 * auVar95._4_4_);
          bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
          auVar126._8_4_ = (float)((uint)bVar12 * auVar109._8_4_ | (uint)!bVar12 * auVar95._8_4_);
          bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
          auVar126._12_4_ = (float)((uint)bVar12 * auVar109._12_4_ | (uint)!bVar12 * auVar95._12_4_)
          ;
          fVar180 = (float)((uint)((byte)(uVar64 >> 4) & 1) * auVar109._16_4_);
          auVar126._16_4_ = fVar180;
          fVar177 = (float)((uint)((byte)(uVar64 >> 5) & 1) * auVar109._20_4_);
          auVar126._20_4_ = fVar177;
          fVar159 = (float)((uint)((byte)(uVar64 >> 6) & 1) * auVar109._24_4_);
          auVar126._24_4_ = fVar159;
          iVar1 = (uint)(byte)(uVar64 >> 7) * auVar109._28_4_;
          auVar126._28_4_ = iVar1;
          auVar110 = vblendmps_avx512vl(ZEXT1632(auVar83),auVar107);
          auVar127._0_4_ =
               (uint)(bVar63 & 1) * auVar110._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar89._0_4_;
          bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
          auVar127._4_4_ = (uint)bVar12 * auVar110._4_4_ | (uint)!bVar12 * auVar89._4_4_;
          bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
          auVar127._8_4_ = (uint)bVar12 * auVar110._8_4_ | (uint)!bVar12 * auVar89._8_4_;
          bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
          auVar127._12_4_ = (uint)bVar12 * auVar110._12_4_ | (uint)!bVar12 * auVar89._12_4_;
          auVar127._16_4_ = (uint)((byte)(uVar64 >> 4) & 1) * auVar110._16_4_;
          auVar127._20_4_ = (uint)((byte)(uVar64 >> 5) & 1) * auVar110._20_4_;
          auVar127._24_4_ = (uint)((byte)(uVar64 >> 6) & 1) * auVar110._24_4_;
          auVar127._28_4_ = (uint)(byte)(uVar64 >> 7) * auVar110._28_4_;
          auVar110 = vblendmps_avx512vl(ZEXT1632(auVar84),ZEXT1632(auVar27));
          auVar128._0_4_ =
               (float)((uint)(bVar63 & 1) * auVar110._0_4_ |
                      (uint)!(bool)(bVar63 & 1) * auVar91._0_4_);
          bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
          auVar128._4_4_ = (float)((uint)bVar12 * auVar110._4_4_ | (uint)!bVar12 * auVar91._4_4_);
          bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
          auVar128._8_4_ = (float)((uint)bVar12 * auVar110._8_4_ | (uint)!bVar12 * auVar91._8_4_);
          bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
          auVar128._12_4_ = (float)((uint)bVar12 * auVar110._12_4_ | (uint)!bVar12 * auVar91._12_4_)
          ;
          fVar149 = (float)((uint)((byte)(uVar64 >> 4) & 1) * auVar110._16_4_);
          auVar128._16_4_ = fVar149;
          fVar174 = (float)((uint)((byte)(uVar64 >> 5) & 1) * auVar110._20_4_);
          auVar128._20_4_ = fVar174;
          fVar173 = (float)((uint)((byte)(uVar64 >> 6) & 1) * auVar110._24_4_);
          auVar128._24_4_ = fVar173;
          auVar128._28_4_ = (uint)(byte)(uVar64 >> 7) * auVar110._28_4_;
          auVar110 = vblendmps_avx512vl(ZEXT1632(auVar88),ZEXT1632(auVar85));
          auVar129._0_4_ =
               (float)((uint)(bVar63 & 1) * auVar110._0_4_ |
                      (uint)!(bool)(bVar63 & 1) * auVar90._0_4_);
          bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
          auVar129._4_4_ = (float)((uint)bVar12 * auVar110._4_4_ | (uint)!bVar12 * auVar90._4_4_);
          bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
          auVar129._8_4_ = (float)((uint)bVar12 * auVar110._8_4_ | (uint)!bVar12 * auVar90._8_4_);
          bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
          auVar129._12_4_ = (float)((uint)bVar12 * auVar110._12_4_ | (uint)!bVar12 * auVar90._12_4_)
          ;
          fVar74 = (float)((uint)((byte)(uVar64 >> 4) & 1) * auVar110._16_4_);
          auVar129._16_4_ = fVar74;
          fVar75 = (float)((uint)((byte)(uVar64 >> 5) & 1) * auVar110._20_4_);
          auVar129._20_4_ = fVar75;
          fVar175 = (float)((uint)((byte)(uVar64 >> 6) & 1) * auVar110._24_4_);
          auVar129._24_4_ = fVar175;
          iVar2 = (uint)(byte)(uVar64 >> 7) * auVar110._28_4_;
          auVar129._28_4_ = iVar2;
          auVar130._0_4_ =
               (uint)(bVar63 & 1) * (int)auVar83._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar107._0_4_;
          bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
          auVar130._4_4_ = (uint)bVar12 * (int)auVar83._4_4_ | (uint)!bVar12 * auVar107._4_4_;
          bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
          auVar130._8_4_ = (uint)bVar12 * (int)auVar83._8_4_ | (uint)!bVar12 * auVar107._8_4_;
          bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
          auVar130._12_4_ = (uint)bVar12 * (int)auVar83._12_4_ | (uint)!bVar12 * auVar107._12_4_;
          auVar130._16_4_ = (uint)!(bool)((byte)(uVar64 >> 4) & 1) * auVar107._16_4_;
          auVar130._20_4_ = (uint)!(bool)((byte)(uVar64 >> 5) & 1) * auVar107._20_4_;
          auVar130._24_4_ = (uint)!(bool)((byte)(uVar64 >> 6) & 1) * auVar107._24_4_;
          auVar130._28_4_ = (uint)!SUB81(uVar64 >> 7,0) * auVar107._28_4_;
          bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
          bVar14 = (bool)((byte)(uVar64 >> 2) & 1);
          bVar16 = (bool)((byte)(uVar64 >> 3) & 1);
          bVar13 = (bool)((byte)(uVar64 >> 1) & 1);
          bVar15 = (bool)((byte)(uVar64 >> 2) & 1);
          bVar17 = (bool)((byte)(uVar64 >> 3) & 1);
          auVar107 = vsubps_avx512vl(auVar130,auVar106);
          auVar111 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar84._12_4_ |
                                                   (uint)!bVar16 * auVar27._12_4_,
                                                   CONCAT48((uint)bVar14 * (int)auVar84._8_4_ |
                                                            (uint)!bVar14 * auVar27._8_4_,
                                                            CONCAT44((uint)bVar12 *
                                                                     (int)auVar84._4_4_ |
                                                                     (uint)!bVar12 * auVar27._4_4_,
                                                                     (uint)(bVar63 & 1) *
                                                                     (int)auVar84._0_4_ |
                                                                     (uint)!(bool)(bVar63 & 1) *
                                                                     auVar27._0_4_)))),auVar98);
          auVar109 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar88._12_4_ |
                                                   (uint)!bVar17 * auVar85._12_4_,
                                                   CONCAT48((uint)bVar15 * (int)auVar88._8_4_ |
                                                            (uint)!bVar15 * auVar85._8_4_,
                                                            CONCAT44((uint)bVar13 *
                                                                     (int)auVar88._4_4_ |
                                                                     (uint)!bVar13 * auVar85._4_4_,
                                                                     (uint)(bVar63 & 1) *
                                                                     (int)auVar88._0_4_ |
                                                                     (uint)!(bool)(bVar63 & 1) *
                                                                     auVar85._0_4_)))),auVar126);
          auVar108 = vsubps_avx(auVar106,auVar127);
          auVar96 = vsubps_avx(auVar98,auVar128);
          auVar97 = vsubps_avx(auVar126,auVar129);
          auVar55._4_4_ = auVar109._4_4_ * fVar136;
          auVar55._0_4_ = auVar109._0_4_ * fVar134;
          auVar55._8_4_ = auVar109._8_4_ * fVar138;
          auVar55._12_4_ = auVar109._12_4_ * fVar140;
          auVar55._16_4_ = auVar109._16_4_ * 0.0;
          auVar55._20_4_ = auVar109._20_4_ * 0.0;
          auVar55._24_4_ = auVar109._24_4_ * 0.0;
          auVar55._28_4_ = 0;
          auVar89 = vfmsub231ps_fma(auVar55,auVar126,auVar107);
          auVar161._0_4_ = fVar135 * auVar107._0_4_;
          auVar161._4_4_ = fVar137 * auVar107._4_4_;
          auVar161._8_4_ = fVar139 * auVar107._8_4_;
          auVar161._12_4_ = fVar141 * auVar107._12_4_;
          auVar161._16_4_ = auVar107._16_4_ * 0.0;
          auVar161._20_4_ = auVar107._20_4_ * 0.0;
          auVar161._24_4_ = auVar107._24_4_ * 0.0;
          auVar161._28_4_ = 0;
          auVar91 = vfmsub231ps_fma(auVar161,auVar106,auVar111);
          auVar110 = vfmadd231ps_avx512vl(ZEXT1632(auVar91),auVar104,ZEXT1632(auVar89));
          auVar168._0_4_ = auVar111._0_4_ * auVar126._0_4_;
          auVar168._4_4_ = auVar111._4_4_ * auVar126._4_4_;
          auVar168._8_4_ = auVar111._8_4_ * auVar126._8_4_;
          auVar168._12_4_ = auVar111._12_4_ * auVar126._12_4_;
          auVar168._16_4_ = auVar111._16_4_ * fVar180;
          auVar168._20_4_ = auVar111._20_4_ * fVar177;
          auVar168._24_4_ = auVar111._24_4_ * fVar159;
          auVar168._28_4_ = 0;
          auVar89 = vfmsub231ps_fma(auVar168,auVar98,auVar109);
          auVar99 = vfmadd231ps_avx512vl(auVar110,auVar104,ZEXT1632(auVar89));
          auVar110 = vmulps_avx512vl(auVar97,auVar127);
          auVar110 = vfmsub231ps_avx512vl(auVar110,auVar108,auVar129);
          auVar56._4_4_ = auVar96._4_4_ * auVar129._4_4_;
          auVar56._0_4_ = auVar96._0_4_ * auVar129._0_4_;
          auVar56._8_4_ = auVar96._8_4_ * auVar129._8_4_;
          auVar56._12_4_ = auVar96._12_4_ * auVar129._12_4_;
          auVar56._16_4_ = auVar96._16_4_ * fVar74;
          auVar56._20_4_ = auVar96._20_4_ * fVar75;
          auVar56._24_4_ = auVar96._24_4_ * fVar175;
          auVar56._28_4_ = iVar2;
          auVar89 = vfmsub231ps_fma(auVar56,auVar128,auVar97);
          auVar169._0_4_ = auVar128._0_4_ * auVar108._0_4_;
          auVar169._4_4_ = auVar128._4_4_ * auVar108._4_4_;
          auVar169._8_4_ = auVar128._8_4_ * auVar108._8_4_;
          auVar169._12_4_ = auVar128._12_4_ * auVar108._12_4_;
          auVar169._16_4_ = fVar149 * auVar108._16_4_;
          auVar169._20_4_ = fVar174 * auVar108._20_4_;
          auVar169._24_4_ = fVar173 * auVar108._24_4_;
          auVar169._28_4_ = 0;
          auVar91 = vfmsub231ps_fma(auVar169,auVar96,auVar127);
          auVar110 = vfmadd231ps_avx512vl(ZEXT1632(auVar91),auVar104,auVar110);
          auVar100 = vfmadd231ps_avx512vl(auVar110,auVar104,ZEXT1632(auVar89));
          auVar110 = vmaxps_avx(auVar99,auVar100);
          uVar150 = vcmpps_avx512vl(auVar110,auVar104,2);
          bVar73 = bVar73 & (byte)uVar150;
          if (bVar73 != 0) {
            auVar57._4_4_ = auVar97._4_4_ * auVar111._4_4_;
            auVar57._0_4_ = auVar97._0_4_ * auVar111._0_4_;
            auVar57._8_4_ = auVar97._8_4_ * auVar111._8_4_;
            auVar57._12_4_ = auVar97._12_4_ * auVar111._12_4_;
            auVar57._16_4_ = auVar97._16_4_ * auVar111._16_4_;
            auVar57._20_4_ = auVar97._20_4_ * auVar111._20_4_;
            auVar57._24_4_ = auVar97._24_4_ * auVar111._24_4_;
            auVar57._28_4_ = auVar110._28_4_;
            auVar90 = vfmsub231ps_fma(auVar57,auVar96,auVar109);
            auVar58._4_4_ = auVar109._4_4_ * auVar108._4_4_;
            auVar58._0_4_ = auVar109._0_4_ * auVar108._0_4_;
            auVar58._8_4_ = auVar109._8_4_ * auVar108._8_4_;
            auVar58._12_4_ = auVar109._12_4_ * auVar108._12_4_;
            auVar58._16_4_ = auVar109._16_4_ * auVar108._16_4_;
            auVar58._20_4_ = auVar109._20_4_ * auVar108._20_4_;
            auVar58._24_4_ = auVar109._24_4_ * auVar108._24_4_;
            auVar58._28_4_ = auVar109._28_4_;
            auVar91 = vfmsub231ps_fma(auVar58,auVar107,auVar97);
            auVar59._4_4_ = auVar96._4_4_ * auVar107._4_4_;
            auVar59._0_4_ = auVar96._0_4_ * auVar107._0_4_;
            auVar59._8_4_ = auVar96._8_4_ * auVar107._8_4_;
            auVar59._12_4_ = auVar96._12_4_ * auVar107._12_4_;
            auVar59._16_4_ = auVar96._16_4_ * auVar107._16_4_;
            auVar59._20_4_ = auVar96._20_4_ * auVar107._20_4_;
            auVar59._24_4_ = auVar96._24_4_ * auVar107._24_4_;
            auVar59._28_4_ = auVar96._28_4_;
            auVar27 = vfmsub231ps_fma(auVar59,auVar108,auVar111);
            auVar89 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar91),ZEXT1632(auVar27));
            auVar110 = vfmadd231ps_avx512vl(ZEXT1632(auVar89),ZEXT1632(auVar90),auVar104);
            auVar111 = vrcp14ps_avx512vl(auVar110);
            auVar108 = auVar195._0_32_;
            auVar109 = vfnmadd213ps_avx512vl(auVar111,auVar110,auVar108);
            auVar89 = vfmadd132ps_fma(auVar109,auVar111,auVar111);
            auVar60._4_4_ = auVar27._4_4_ * auVar126._4_4_;
            auVar60._0_4_ = auVar27._0_4_ * auVar126._0_4_;
            auVar60._8_4_ = auVar27._8_4_ * auVar126._8_4_;
            auVar60._12_4_ = auVar27._12_4_ * auVar126._12_4_;
            auVar60._16_4_ = fVar180 * 0.0;
            auVar60._20_4_ = fVar177 * 0.0;
            auVar60._24_4_ = fVar159 * 0.0;
            auVar60._28_4_ = iVar1;
            auVar91 = vfmadd231ps_fma(auVar60,auVar98,ZEXT1632(auVar91));
            auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar106,ZEXT1632(auVar90));
            fVar159 = auVar89._0_4_;
            fVar177 = auVar89._4_4_;
            fVar180 = auVar89._8_4_;
            fVar149 = auVar89._12_4_;
            local_5a0 = ZEXT1632(CONCAT412(auVar91._12_4_ * fVar149,
                                           CONCAT48(auVar91._8_4_ * fVar180,
                                                    CONCAT44(auVar91._4_4_ * fVar177,
                                                             auVar91._0_4_ * fVar159))));
            auVar62._4_4_ = uStack_65c;
            auVar62._0_4_ = local_660;
            auVar62._8_4_ = uStack_658;
            auVar62._12_4_ = uStack_654;
            auVar62._16_4_ = uStack_650;
            auVar62._20_4_ = uStack_64c;
            auVar62._24_4_ = uStack_648;
            auVar62._28_4_ = uStack_644;
            uVar150 = vcmpps_avx512vl(local_5a0,auVar62,0xd);
            uVar142 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar36._4_4_ = uVar142;
            auVar36._0_4_ = uVar142;
            auVar36._8_4_ = uVar142;
            auVar36._12_4_ = uVar142;
            auVar36._16_4_ = uVar142;
            auVar36._20_4_ = uVar142;
            auVar36._24_4_ = uVar142;
            auVar36._28_4_ = uVar142;
            uVar30 = vcmpps_avx512vl(local_5a0,auVar36,2);
            bVar73 = (byte)uVar150 & (byte)uVar30 & bVar73;
            if (bVar73 != 0) {
              uVar150 = vcmpps_avx512vl(auVar110,auVar104,4);
              bVar73 = bVar73 & (byte)uVar150;
              auVar194 = ZEXT3264(local_840);
              auVar148 = ZEXT3264(local_860);
              if (bVar73 != 0) {
                fVar174 = auVar99._0_4_ * fVar159;
                fVar173 = auVar99._4_4_ * fVar177;
                auVar61._4_4_ = fVar173;
                auVar61._0_4_ = fVar174;
                fVar175 = auVar99._8_4_ * fVar180;
                auVar61._8_4_ = fVar175;
                fVar74 = auVar99._12_4_ * fVar149;
                auVar61._12_4_ = fVar74;
                fVar75 = auVar99._16_4_ * 0.0;
                auVar61._16_4_ = fVar75;
                fVar134 = auVar99._20_4_ * 0.0;
                auVar61._20_4_ = fVar134;
                fVar135 = auVar99._24_4_ * 0.0;
                auVar61._24_4_ = fVar135;
                auVar61._28_4_ = auVar110._28_4_;
                auVar111 = vsubps_avx512vl(auVar108,auVar61);
                local_5e0._0_4_ =
                     (float)((uint)(bVar63 & 1) * (int)fVar174 |
                            (uint)!(bool)(bVar63 & 1) * auVar111._0_4_);
                bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
                local_5e0._4_4_ =
                     (float)((uint)bVar12 * (int)fVar173 | (uint)!bVar12 * auVar111._4_4_);
                bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
                local_5e0._8_4_ =
                     (float)((uint)bVar12 * (int)fVar175 | (uint)!bVar12 * auVar111._8_4_);
                bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
                local_5e0._12_4_ =
                     (float)((uint)bVar12 * (int)fVar74 | (uint)!bVar12 * auVar111._12_4_);
                bVar12 = (bool)((byte)(uVar64 >> 4) & 1);
                local_5e0._16_4_ =
                     (float)((uint)bVar12 * (int)fVar75 | (uint)!bVar12 * auVar111._16_4_);
                bVar12 = (bool)((byte)(uVar64 >> 5) & 1);
                local_5e0._20_4_ =
                     (float)((uint)bVar12 * (int)fVar134 | (uint)!bVar12 * auVar111._20_4_);
                bVar12 = (bool)((byte)(uVar64 >> 6) & 1);
                local_5e0._24_4_ =
                     (float)((uint)bVar12 * (int)fVar135 | (uint)!bVar12 * auVar111._24_4_);
                bVar12 = SUB81(uVar64 >> 7,0);
                local_5e0._28_4_ =
                     (float)((uint)bVar12 * auVar110._28_4_ | (uint)!bVar12 * auVar111._28_4_);
                auVar110 = vsubps_avx(ZEXT1632(auVar94),auVar101);
                auVar89 = vfmadd213ps_fma(auVar110,local_5e0,auVar101);
                uVar142 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
                auVar37._4_4_ = uVar142;
                auVar37._0_4_ = uVar142;
                auVar37._8_4_ = uVar142;
                auVar37._12_4_ = uVar142;
                auVar37._16_4_ = uVar142;
                auVar37._20_4_ = uVar142;
                auVar37._24_4_ = uVar142;
                auVar37._28_4_ = uVar142;
                auVar110 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar89._12_4_ + auVar89._12_4_,
                                                              CONCAT48(auVar89._8_4_ + auVar89._8_4_
                                                                       ,CONCAT44(auVar89._4_4_ +
                                                                                 auVar89._4_4_,
                                                                                 auVar89._0_4_ +
                                                                                 auVar89._0_4_)))),
                                           auVar37);
                uVar150 = vcmpps_avx512vl(local_5a0,auVar110,6);
                if (((byte)uVar150 & bVar73) != 0) {
                  auVar154._0_4_ = auVar100._0_4_ * fVar159;
                  auVar154._4_4_ = auVar100._4_4_ * fVar177;
                  auVar154._8_4_ = auVar100._8_4_ * fVar180;
                  auVar154._12_4_ = auVar100._12_4_ * fVar149;
                  auVar154._16_4_ = auVar100._16_4_ * 0.0;
                  auVar154._20_4_ = auVar100._20_4_ * 0.0;
                  auVar154._24_4_ = auVar100._24_4_ * 0.0;
                  auVar154._28_4_ = 0;
                  auVar110 = vsubps_avx512vl(auVar108,auVar154);
                  auVar131._0_4_ =
                       (uint)(bVar63 & 1) * (int)auVar154._0_4_ |
                       (uint)!(bool)(bVar63 & 1) * auVar110._0_4_;
                  bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
                  auVar131._4_4_ =
                       (uint)bVar12 * (int)auVar154._4_4_ | (uint)!bVar12 * auVar110._4_4_;
                  bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
                  auVar131._8_4_ =
                       (uint)bVar12 * (int)auVar154._8_4_ | (uint)!bVar12 * auVar110._8_4_;
                  bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
                  auVar131._12_4_ =
                       (uint)bVar12 * (int)auVar154._12_4_ | (uint)!bVar12 * auVar110._12_4_;
                  bVar12 = (bool)((byte)(uVar64 >> 4) & 1);
                  auVar131._16_4_ =
                       (uint)bVar12 * (int)auVar154._16_4_ | (uint)!bVar12 * auVar110._16_4_;
                  bVar12 = (bool)((byte)(uVar64 >> 5) & 1);
                  auVar131._20_4_ =
                       (uint)bVar12 * (int)auVar154._20_4_ | (uint)!bVar12 * auVar110._20_4_;
                  bVar12 = (bool)((byte)(uVar64 >> 6) & 1);
                  auVar131._24_4_ =
                       (uint)bVar12 * (int)auVar154._24_4_ | (uint)!bVar12 * auVar110._24_4_;
                  auVar131._28_4_ = (uint)!SUB81(uVar64 >> 7,0) * auVar110._28_4_;
                  auVar38._8_4_ = 0x40000000;
                  auVar38._0_8_ = 0x4000000040000000;
                  auVar38._12_4_ = 0x40000000;
                  auVar38._16_4_ = 0x40000000;
                  auVar38._20_4_ = 0x40000000;
                  auVar38._24_4_ = 0x40000000;
                  auVar38._28_4_ = 0x40000000;
                  local_5c0 = vfmsub132ps_avx512vl(auVar131,auVar108,auVar38);
                  local_580 = (undefined4)lVar66;
                  local_570 = local_7f0._0_8_;
                  uStack_568 = local_7f0._8_8_;
                  local_560 = local_800._0_8_;
                  uStack_558 = local_800._8_8_;
                  local_550 = local_810._0_8_;
                  uStack_548 = local_810._8_8_;
                  pGVar8 = (context->scene->geometries).items[uVar6].ptr;
                  if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) {
                    bVar63 = 0;
                  }
                  else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                          (bVar63 = 1, pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar89 = vcvtsi2ss_avx512f(auVar195._0_16_,local_580);
                    fVar159 = auVar89._0_4_;
                    local_520[0] = (fVar159 + local_5e0._0_4_ + 0.0) * (float)local_680._0_4_;
                    local_520[1] = (fVar159 + local_5e0._4_4_ + 1.0) * (float)local_680._4_4_;
                    local_520[2] = (fVar159 + local_5e0._8_4_ + 2.0) * fStack_678;
                    local_520[3] = (fVar159 + local_5e0._12_4_ + 3.0) * fStack_674;
                    fStack_510 = (fVar159 + local_5e0._16_4_ + 4.0) * fStack_670;
                    fStack_50c = (fVar159 + local_5e0._20_4_ + 5.0) * fStack_66c;
                    fStack_508 = (fVar159 + local_5e0._24_4_ + 6.0) * fStack_668;
                    fStack_504 = fVar159 + local_5e0._28_4_ + 7.0;
                    local_500 = local_5c0;
                    local_4e0 = local_5a0;
                    uVar64 = 0;
                    uVar70 = (ulong)((byte)uVar150 & bVar73);
                    for (uVar68 = uVar70; local_57c = iVar7, (uVar68 & 1) == 0;
                        uVar68 = uVar68 >> 1 | 0x8000000000000000) {
                      uVar64 = uVar64 + 1;
                    }
                    while (auVar89 = auVar196._0_16_, uVar70 != 0) {
                      uVar142 = *(undefined4 *)(ray + k * 4 + 0x200);
                      local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_520[uVar64]));
                      local_1c0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_500 + uVar64 * 4)));
                      *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_4e0 + uVar64 * 4)
                      ;
                      local_890.context = context->user;
                      fVar149 = local_200._0_4_;
                      fVar159 = 1.0 - fVar149;
                      auVar33._8_4_ = 0x80000000;
                      auVar33._0_8_ = 0x8000000080000000;
                      auVar33._12_4_ = 0x80000000;
                      auVar91 = vxorps_avx512vl(ZEXT416((uint)fVar159),auVar33);
                      auVar89 = ZEXT416((uint)(fVar149 * fVar159 * 4.0));
                      auVar94 = vfnmsub213ss_fma(local_200._0_16_,local_200._0_16_,auVar89);
                      auVar89 = vfmadd213ss_fma(ZEXT416((uint)fVar159),ZEXT416((uint)fVar159),
                                                auVar89);
                      fVar159 = fVar159 * auVar91._0_4_ * 0.5;
                      fVar177 = auVar94._0_4_ * 0.5;
                      fVar180 = auVar89._0_4_ * 0.5;
                      fVar149 = fVar149 * fVar149 * 0.5;
                      auVar172._0_4_ = fVar149 * (float)local_690._0_4_;
                      auVar172._4_4_ = fVar149 * (float)local_690._4_4_;
                      auVar172._8_4_ = fVar149 * fStack_688;
                      auVar172._12_4_ = fVar149 * fStack_684;
                      auVar146._4_4_ = fVar180;
                      auVar146._0_4_ = fVar180;
                      auVar146._8_4_ = fVar180;
                      auVar146._12_4_ = fVar180;
                      auVar89 = vfmadd132ps_fma(auVar146,auVar172,local_810);
                      auVar165._4_4_ = fVar177;
                      auVar165._0_4_ = fVar177;
                      auVar165._8_4_ = fVar177;
                      auVar165._12_4_ = fVar177;
                      auVar89 = vfmadd132ps_fma(auVar165,auVar89,local_800);
                      auVar147._4_4_ = fVar159;
                      auVar147._0_4_ = fVar159;
                      auVar147._8_4_ = fVar159;
                      auVar147._12_4_ = fVar159;
                      auVar89 = vfmadd132ps_fma(auVar147,auVar89,local_7f0);
                      auVar148 = vbroadcastss_avx512f(auVar89);
                      auVar200 = vbroadcastss_avx512f(ZEXT416(1));
                      local_280 = vpermps_avx512f(auVar200,ZEXT1664(auVar89));
                      auVar200 = vbroadcastss_avx512f(ZEXT416(2));
                      local_240 = vpermps_avx512f(auVar200,ZEXT1664(auVar89));
                      local_2c0[0] = (RTCHitN)auVar148[0];
                      local_2c0[1] = (RTCHitN)auVar148[1];
                      local_2c0[2] = (RTCHitN)auVar148[2];
                      local_2c0[3] = (RTCHitN)auVar148[3];
                      local_2c0[4] = (RTCHitN)auVar148[4];
                      local_2c0[5] = (RTCHitN)auVar148[5];
                      local_2c0[6] = (RTCHitN)auVar148[6];
                      local_2c0[7] = (RTCHitN)auVar148[7];
                      local_2c0[8] = (RTCHitN)auVar148[8];
                      local_2c0[9] = (RTCHitN)auVar148[9];
                      local_2c0[10] = (RTCHitN)auVar148[10];
                      local_2c0[0xb] = (RTCHitN)auVar148[0xb];
                      local_2c0[0xc] = (RTCHitN)auVar148[0xc];
                      local_2c0[0xd] = (RTCHitN)auVar148[0xd];
                      local_2c0[0xe] = (RTCHitN)auVar148[0xe];
                      local_2c0[0xf] = (RTCHitN)auVar148[0xf];
                      local_2c0[0x10] = (RTCHitN)auVar148[0x10];
                      local_2c0[0x11] = (RTCHitN)auVar148[0x11];
                      local_2c0[0x12] = (RTCHitN)auVar148[0x12];
                      local_2c0[0x13] = (RTCHitN)auVar148[0x13];
                      local_2c0[0x14] = (RTCHitN)auVar148[0x14];
                      local_2c0[0x15] = (RTCHitN)auVar148[0x15];
                      local_2c0[0x16] = (RTCHitN)auVar148[0x16];
                      local_2c0[0x17] = (RTCHitN)auVar148[0x17];
                      local_2c0[0x18] = (RTCHitN)auVar148[0x18];
                      local_2c0[0x19] = (RTCHitN)auVar148[0x19];
                      local_2c0[0x1a] = (RTCHitN)auVar148[0x1a];
                      local_2c0[0x1b] = (RTCHitN)auVar148[0x1b];
                      local_2c0[0x1c] = (RTCHitN)auVar148[0x1c];
                      local_2c0[0x1d] = (RTCHitN)auVar148[0x1d];
                      local_2c0[0x1e] = (RTCHitN)auVar148[0x1e];
                      local_2c0[0x1f] = (RTCHitN)auVar148[0x1f];
                      local_2c0[0x20] = (RTCHitN)auVar148[0x20];
                      local_2c0[0x21] = (RTCHitN)auVar148[0x21];
                      local_2c0[0x22] = (RTCHitN)auVar148[0x22];
                      local_2c0[0x23] = (RTCHitN)auVar148[0x23];
                      local_2c0[0x24] = (RTCHitN)auVar148[0x24];
                      local_2c0[0x25] = (RTCHitN)auVar148[0x25];
                      local_2c0[0x26] = (RTCHitN)auVar148[0x26];
                      local_2c0[0x27] = (RTCHitN)auVar148[0x27];
                      local_2c0[0x28] = (RTCHitN)auVar148[0x28];
                      local_2c0[0x29] = (RTCHitN)auVar148[0x29];
                      local_2c0[0x2a] = (RTCHitN)auVar148[0x2a];
                      local_2c0[0x2b] = (RTCHitN)auVar148[0x2b];
                      local_2c0[0x2c] = (RTCHitN)auVar148[0x2c];
                      local_2c0[0x2d] = (RTCHitN)auVar148[0x2d];
                      local_2c0[0x2e] = (RTCHitN)auVar148[0x2e];
                      local_2c0[0x2f] = (RTCHitN)auVar148[0x2f];
                      local_2c0[0x30] = (RTCHitN)auVar148[0x30];
                      local_2c0[0x31] = (RTCHitN)auVar148[0x31];
                      local_2c0[0x32] = (RTCHitN)auVar148[0x32];
                      local_2c0[0x33] = (RTCHitN)auVar148[0x33];
                      local_2c0[0x34] = (RTCHitN)auVar148[0x34];
                      local_2c0[0x35] = (RTCHitN)auVar148[0x35];
                      local_2c0[0x36] = (RTCHitN)auVar148[0x36];
                      local_2c0[0x37] = (RTCHitN)auVar148[0x37];
                      local_2c0[0x38] = (RTCHitN)auVar148[0x38];
                      local_2c0[0x39] = (RTCHitN)auVar148[0x39];
                      local_2c0[0x3a] = (RTCHitN)auVar148[0x3a];
                      local_2c0[0x3b] = (RTCHitN)auVar148[0x3b];
                      local_2c0[0x3c] = (RTCHitN)auVar148[0x3c];
                      local_2c0[0x3d] = (RTCHitN)auVar148[0x3d];
                      local_2c0[0x3e] = (RTCHitN)auVar148[0x3e];
                      local_2c0[0x3f] = (RTCHitN)auVar148[0x3f];
                      local_180 = local_300._0_8_;
                      uStack_178 = local_300._8_8_;
                      uStack_170 = local_300._16_8_;
                      uStack_168 = local_300._24_8_;
                      uStack_160 = local_300._32_8_;
                      uStack_158 = local_300._40_8_;
                      uStack_150 = local_300._48_8_;
                      uStack_148 = local_300._56_8_;
                      auVar148 = vmovdqa64_avx512f(local_480);
                      local_140 = vmovdqa64_avx512f(auVar148);
                      vpcmpeqd_avx2(auVar148._0_32_,auVar148._0_32_);
                      local_100 = vbroadcastss_avx512f(ZEXT416((local_890.context)->instID[0]));
                      local_c0 = vbroadcastss_avx512f(ZEXT416((local_890.context)->instPrimID[0]));
                      auVar148 = vmovdqa64_avx512f(local_340);
                      local_640 = vmovdqa64_avx512f(auVar148);
                      local_890.valid = (int *)local_640;
                      local_890.geometryUserPtr = pGVar8->userPtr;
                      local_890.hit = local_2c0;
                      local_890.N = 0x10;
                      local_4c0._0_8_ = uVar64;
                      uVar68 = uVar64;
                      local_890.ray = (RTCRayN *)ray;
                      if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar8->occlusionFilterN)(&local_890);
                        auVar148 = vmovdqa64_avx512f(local_640);
                        uVar68 = local_4c0._0_8_;
                      }
                      uVar150 = vptestmd_avx512f(auVar148,auVar148);
                      if ((short)uVar150 != 0) {
                        p_Var11 = context->args->filter;
                        if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var11)(&local_890);
                          auVar148 = vmovdqa64_avx512f(local_640);
                          uVar68 = local_4c0._0_8_;
                        }
                        auVar89 = auVar196._0_16_;
                        uVar64 = vptestmd_avx512f(auVar148,auVar148);
                        auVar200 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                        bVar12 = (bool)((byte)uVar64 & 1);
                        auVar148._0_4_ =
                             (uint)bVar12 * auVar200._0_4_ |
                             (uint)!bVar12 * *(int *)(local_890.ray + 0x200);
                        bVar12 = (bool)((byte)(uVar64 >> 1) & 1);
                        auVar148._4_4_ =
                             (uint)bVar12 * auVar200._4_4_ |
                             (uint)!bVar12 * *(int *)(local_890.ray + 0x204);
                        bVar12 = (bool)((byte)(uVar64 >> 2) & 1);
                        auVar148._8_4_ =
                             (uint)bVar12 * auVar200._8_4_ |
                             (uint)!bVar12 * *(int *)(local_890.ray + 0x208);
                        bVar12 = (bool)((byte)(uVar64 >> 3) & 1);
                        auVar148._12_4_ =
                             (uint)bVar12 * auVar200._12_4_ |
                             (uint)!bVar12 * *(int *)(local_890.ray + 0x20c);
                        bVar12 = (bool)((byte)(uVar64 >> 4) & 1);
                        auVar148._16_4_ =
                             (uint)bVar12 * auVar200._16_4_ |
                             (uint)!bVar12 * *(int *)(local_890.ray + 0x210);
                        bVar12 = (bool)((byte)(uVar64 >> 5) & 1);
                        auVar148._20_4_ =
                             (uint)bVar12 * auVar200._20_4_ |
                             (uint)!bVar12 * *(int *)(local_890.ray + 0x214);
                        bVar12 = (bool)((byte)(uVar64 >> 6) & 1);
                        auVar148._24_4_ =
                             (uint)bVar12 * auVar200._24_4_ |
                             (uint)!bVar12 * *(int *)(local_890.ray + 0x218);
                        bVar12 = (bool)((byte)(uVar64 >> 7) & 1);
                        auVar148._28_4_ =
                             (uint)bVar12 * auVar200._28_4_ |
                             (uint)!bVar12 * *(int *)(local_890.ray + 0x21c);
                        bVar12 = (bool)((byte)(uVar64 >> 8) & 1);
                        auVar148._32_4_ =
                             (uint)bVar12 * auVar200._32_4_ |
                             (uint)!bVar12 * *(int *)(local_890.ray + 0x220);
                        bVar12 = (bool)((byte)(uVar64 >> 9) & 1);
                        auVar148._36_4_ =
                             (uint)bVar12 * auVar200._36_4_ |
                             (uint)!bVar12 * *(int *)(local_890.ray + 0x224);
                        bVar12 = (bool)((byte)(uVar64 >> 10) & 1);
                        auVar148._40_4_ =
                             (uint)bVar12 * auVar200._40_4_ |
                             (uint)!bVar12 * *(int *)(local_890.ray + 0x228);
                        bVar12 = (bool)((byte)(uVar64 >> 0xb) & 1);
                        auVar148._44_4_ =
                             (uint)bVar12 * auVar200._44_4_ |
                             (uint)!bVar12 * *(int *)(local_890.ray + 0x22c);
                        bVar12 = (bool)((byte)(uVar64 >> 0xc) & 1);
                        auVar148._48_4_ =
                             (uint)bVar12 * auVar200._48_4_ |
                             (uint)!bVar12 * *(int *)(local_890.ray + 0x230);
                        bVar12 = (bool)((byte)(uVar64 >> 0xd) & 1);
                        auVar148._52_4_ =
                             (uint)bVar12 * auVar200._52_4_ |
                             (uint)!bVar12 * *(int *)(local_890.ray + 0x234);
                        bVar12 = (bool)((byte)(uVar64 >> 0xe) & 1);
                        auVar148._56_4_ =
                             (uint)bVar12 * auVar200._56_4_ |
                             (uint)!bVar12 * *(int *)(local_890.ray + 0x238);
                        bVar12 = SUB81(uVar64 >> 0xf,0);
                        auVar148._60_4_ =
                             (uint)bVar12 * auVar200._60_4_ |
                             (uint)!bVar12 * *(int *)(local_890.ray + 0x23c);
                        *(undefined1 (*) [64])(local_890.ray + 0x200) = auVar148;
                        if ((short)uVar64 != 0) {
                          bVar63 = 1;
                          goto LAB_018f02a0;
                        }
                      }
                      *(undefined4 *)(ray + k * 4 + 0x200) = uVar142;
                      uVar64 = 0;
                      uVar70 = uVar70 ^ 1L << (uVar68 & 0x3f);
                      for (uVar68 = uVar70; (uVar68 & 1) == 0;
                          uVar68 = uVar68 >> 1 | 0x8000000000000000) {
                        uVar64 = uVar64 + 1;
                      }
                    }
                    bVar63 = 0;
LAB_018f02a0:
                    auVar110 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar195 = ZEXT3264(auVar110);
                    auVar89 = vxorps_avx512vl(auVar89,auVar89);
                    auVar196 = ZEXT1664(auVar89);
                    auVar197 = ZEXT3264(local_700);
                    auVar198 = ZEXT3264(local_6e0);
                    auVar194 = ZEXT3264(local_840);
                    auVar148 = ZEXT3264(local_860);
                    auVar199 = ZEXT3264(local_7a0);
                    auVar201 = ZEXT3264(local_720);
                    auVar200 = ZEXT3264(local_7c0);
                    auVar202 = ZEXT3264(local_7e0);
                  }
                  bVar69 = (bool)(bVar69 | bVar63);
                }
              }
              goto LAB_018f027f;
            }
          }
          auVar194 = ZEXT3264(local_840);
          auVar148 = ZEXT3264(local_860);
        }
LAB_018f027f:
      }
    }
    if (bVar69) break;
    uVar142 = *(undefined4 *)(ray + k * 4 + 0x200);
    auVar32._4_4_ = uVar142;
    auVar32._0_4_ = uVar142;
    auVar32._8_4_ = uVar142;
    auVar32._12_4_ = uVar142;
    uVar150 = vcmpps_avx512vl(local_5f0,auVar32,2);
  }
  return uVar72 != 0;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }